

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_rgb.c
# Opt level: O1

void rgb24_yuv420_sseu(uint32_t width,uint32_t height,uint8_t *RGB,uint32_t RGB_stride,uint8_t *Y,
                      uint8_t *U,uint8_t *V,uint32_t Y_stride,uint32_t UV_stride,YCbCrType yuv_type)

{
  byte *pbVar1;
  uint8_t *puVar2;
  byte *pbVar3;
  uint8_t *puVar4;
  byte *pbVar5;
  byte bVar6;
  byte bVar22;
  int iVar38;
  int iVar39;
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  byte bVar73;
  byte bVar74;
  uint8_t uVar75;
  uint8_t uVar76;
  uint8_t uVar77;
  byte bVar78;
  byte bVar79;
  byte bVar80;
  byte bVar81;
  byte bVar82;
  byte bVar83;
  byte bVar84;
  byte bVar85;
  byte bVar86;
  byte bVar87;
  byte bVar88;
  byte bVar89;
  byte bVar90;
  byte bVar91;
  byte bVar92;
  byte bVar93;
  byte bVar94;
  byte bVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [15];
  unkuint9 Var142;
  undefined1 auVar143 [11];
  undefined1 auVar144 [13];
  undefined1 auVar145 [15];
  unkuint9 Var146;
  undefined1 auVar147 [11];
  undefined1 auVar148 [13];
  undefined1 auVar149 [15];
  unkuint9 Var150;
  undefined1 auVar151 [11];
  undefined1 auVar152 [13];
  undefined1 auVar153 [15];
  undefined1 auVar154 [11];
  undefined1 auVar155 [13];
  undefined1 auVar156 [15];
  undefined1 auVar157 [11];
  undefined1 auVar158 [13];
  undefined1 auVar159 [15];
  unkuint9 Var160;
  undefined1 auVar161 [11];
  undefined1 auVar162 [13];
  undefined1 auVar163 [15];
  undefined1 auVar164 [11];
  undefined1 auVar165 [13];
  undefined1 auVar166 [15];
  undefined1 auVar167 [11];
  undefined1 auVar168 [13];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [14];
  undefined1 auVar205 [12];
  unkuint10 Var206;
  undefined1 auVar207 [14];
  undefined1 auVar208 [12];
  unkuint10 Var209;
  undefined1 auVar210 [14];
  undefined1 auVar211 [12];
  unkuint10 Var212;
  undefined1 auVar213 [14];
  undefined1 auVar214 [12];
  undefined1 auVar215 [14];
  undefined1 auVar216 [12];
  unkuint10 Var217;
  undefined1 auVar218 [14];
  undefined1 auVar219 [12];
  undefined1 auVar220 [14];
  undefined1 auVar221 [12];
  undefined1 auVar222 [14];
  undefined1 auVar223 [12];
  undefined3 uVar224;
  undefined3 uVar225;
  undefined3 uVar226;
  undefined8 uVar227;
  undefined1 auVar228 [15];
  undefined1 auVar229 [15];
  undefined1 auVar230 [15];
  undefined1 auVar231 [15];
  undefined1 auVar232 [15];
  undefined1 auVar233 [15];
  undefined8 uVar234;
  undefined1 auVar235 [15];
  undefined1 auVar236 [15];
  undefined1 auVar237 [15];
  undefined1 auVar238 [15];
  undefined8 uVar239;
  undefined1 auVar240 [15];
  undefined1 auVar241 [15];
  undefined1 auVar242 [15];
  undefined1 auVar243 [15];
  undefined1 auVar244 [15];
  undefined1 auVar245 [15];
  undefined1 auVar246 [15];
  undefined1 auVar247 [15];
  undefined1 auVar248 [15];
  undefined1 auVar249 [15];
  undefined1 auVar250 [15];
  undefined1 auVar251 [15];
  undefined1 auVar252 [15];
  undefined1 auVar253 [15];
  uint uVar254;
  uint uVar255;
  uint uVar256;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [15];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [15];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [15];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined5 uVar280;
  undefined5 uVar281;
  undefined5 uVar282;
  undefined1 auVar283 [12];
  undefined8 uVar284;
  undefined1 auVar285 [12];
  undefined8 uVar286;
  undefined1 auVar287 [12];
  undefined8 uVar288;
  undefined1 auVar289 [12];
  undefined1 auVar290 [12];
  undefined1 auVar291 [12];
  undefined1 auVar292 [15];
  undefined1 auVar293 [15];
  undefined1 auVar294 [12];
  undefined1 auVar295 [15];
  undefined1 auVar296 [15];
  undefined1 auVar297 [12];
  undefined1 auVar298 [15];
  undefined1 auVar299 [15];
  undefined1 auVar300 [12];
  undefined1 auVar301 [15];
  undefined1 auVar302 [12];
  undefined1 auVar303 [15];
  undefined1 auVar304 [15];
  undefined1 auVar305 [15];
  undefined1 auVar306 [15];
  undefined1 auVar307 [14];
  undefined8 uVar308;
  undefined1 auVar309 [14];
  undefined8 uVar310;
  undefined1 auVar311 [14];
  undefined8 uVar312;
  undefined1 auVar313 [14];
  undefined1 auVar314 [14];
  undefined1 auVar315 [15];
  undefined1 auVar316 [14];
  undefined1 auVar317 [15];
  undefined1 auVar318 [15];
  undefined1 auVar319 [14];
  undefined1 auVar320 [15];
  undefined1 auVar321 [15];
  undefined1 auVar322 [14];
  undefined1 auVar323 [15];
  undefined1 auVar324 [15];
  undefined1 auVar325 [14];
  undefined1 auVar326 [15];
  undefined1 auVar327 [14];
  ulong uVar328;
  undefined1 auVar329 [15];
  ulong uVar330;
  undefined1 auVar331 [15];
  ulong uVar332;
  undefined1 auVar333 [15];
  ulong uVar334;
  ulong uVar335;
  uint8_t *puVar336;
  long lVar337;
  uint uVar338;
  uint uVar339;
  ulong uVar340;
  short sVar341;
  undefined1 auVar342 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  ushort uVar352;
  ushort uVar360;
  ushort uVar361;
  ushort uVar362;
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  ushort uVar363;
  short sVar364;
  ushort uVar381;
  ushort uVar384;
  ushort uVar387;
  ushort uVar389;
  ushort uVar391;
  ushort uVar393;
  undefined1 auVar365 [16];
  short sVar382;
  short sVar385;
  short sVar388;
  short sVar390;
  short sVar392;
  short sVar394;
  ushort uVar395;
  short sVar396;
  undefined1 auVar373 [16];
  short sVar397;
  short sVar398;
  short sVar399;
  short sVar400;
  short sVar401;
  short sVar402;
  short sVar403;
  short sVar404;
  ushort uVar405;
  ushort uVar414;
  ushort uVar415;
  ushort uVar416;
  ushort uVar417;
  ushort uVar418;
  ushort uVar419;
  undefined1 auVar406 [16];
  ushort uVar420;
  undefined1 auVar413 [16];
  ushort uVar421;
  ushort uVar432;
  ushort uVar433;
  ushort uVar434;
  ushort uVar435;
  ushort uVar436;
  ushort uVar437;
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  ushort uVar438;
  undefined1 auVar424 [16];
  ushort uVar439;
  ushort uVar440;
  ushort uVar441;
  ushort uVar442;
  ushort uVar443;
  ushort uVar444;
  ushort uVar445;
  short sVar446;
  ushort uVar447;
  short sVar448;
  undefined1 auVar449 [16];
  undefined1 auVar457 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar476 [16];
  short sVar488;
  short sVar489;
  short sVar490;
  short sVar491;
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  short sVar492;
  short sVar493;
  short sVar497;
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar498 [16];
  short sVar506;
  short sVar515;
  short sVar516;
  short sVar517;
  short sVar518;
  short sVar519;
  short sVar520;
  undefined1 auVar507 [16];
  short sVar521;
  short local_e8;
  short sStack_e6;
  short local_d8;
  short sStack_d6;
  undefined1 local_c8 [16];
  short local_a8;
  short sStack_a6;
  short local_98;
  short sStack_96;
  short local_88;
  short sStack_86;
  short local_78;
  short sStack_76;
  short local_68;
  short sStack_66;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar374 [16];
  undefined1 auVar368 [16];
  undefined1 auVar375 [16];
  undefined1 auVar369 [16];
  undefined1 auVar376 [16];
  undefined1 auVar370 [16];
  undefined1 auVar377 [16];
  undefined1 auVar371 [16];
  undefined1 auVar378 [16];
  undefined1 auVar372 [16];
  undefined1 auVar379 [16];
  byte bVar380;
  byte bVar383;
  byte bVar386;
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar450 [16];
  undefined1 auVar458 [16];
  undefined1 auVar451 [16];
  undefined1 auVar459 [16];
  undefined1 auVar452 [16];
  undefined1 auVar460 [16];
  undefined1 auVar453 [16];
  undefined1 auVar461 [16];
  undefined1 auVar454 [16];
  undefined1 auVar462 [16];
  undefined1 auVar455 [16];
  undefined1 auVar463 [16];
  undefined1 auVar456 [16];
  undefined1 auVar464 [16];
  undefined1 auVar469 [16];
  undefined1 auVar477 [16];
  undefined1 auVar470 [16];
  undefined1 auVar478 [16];
  undefined1 auVar471 [16];
  undefined1 auVar479 [16];
  undefined1 auVar472 [16];
  undefined1 auVar480 [16];
  undefined1 auVar473 [16];
  undefined1 auVar481 [16];
  undefined1 auVar474 [16];
  undefined1 auVar482 [16];
  undefined1 auVar475 [16];
  undefined1 auVar483 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  
  if (height != 1) {
    uVar334 = (ulong)yuv_type;
    iVar38 = RGB_stride * 2;
    iVar39 = Y_stride * 2;
    uVar340 = 0;
    uVar338 = 0;
    uVar339 = 0;
    do {
      if (width != 0x1f) {
        uVar335 = (ulong)((uVar339 >> 1) * UV_stride);
        auVar353 = pshuflw(ZEXT116(RGB2YUV[uVar334].r_factor),ZEXT116(RGB2YUV[uVar334].r_factor),0);
        auVar354 = pshuflw(ZEXT116(RGB2YUV[uVar334].g_factor),ZEXT116(RGB2YUV[uVar334].g_factor),0);
        auVar355 = pshuflw(ZEXT116(RGB2YUV[uVar334].b_factor),ZEXT116(RGB2YUV[uVar334].b_factor),0);
        auVar356 = pshuflw(ZEXT116(RGB2YUV[uVar334].y_factor),ZEXT116(RGB2YUV[uVar334].y_factor),0);
        auVar357 = pshuflw(ZEXT116(RGB2YUV[uVar334].y_offset),ZEXT116(RGB2YUV[uVar334].y_offset),0);
        auVar358 = pshuflw(ZEXT116(RGB2YUV[uVar334].cb_factor),ZEXT116(RGB2YUV[uVar334].cb_factor),0
                          );
        auVar359 = pshuflw(ZEXT116(RGB2YUV[uVar334].cr_factor),ZEXT116(RGB2YUV[uVar334].cr_factor),0
                          );
        lVar337 = 0;
        puVar336 = RGB;
        do {
          auVar466 = *(undefined1 (*) [16])(puVar336 + uVar338);
          auVar486 = *(undefined1 (*) [16])(puVar336 + (ulong)uVar338 + 0x10);
          pbVar1 = puVar336 + RGB_stride;
          bVar33 = *pbVar1;
          bVar13 = pbVar1[1];
          bVar37 = pbVar1[2];
          bVar6 = pbVar1[3];
          bVar36 = pbVar1[4];
          bVar35 = pbVar1[5];
          bVar34 = pbVar1[6];
          bVar21 = pbVar1[7];
          bVar32 = pbVar1[8];
          bVar31 = pbVar1[9];
          bVar30 = pbVar1[10];
          bVar29 = pbVar1[0xb];
          bVar22 = pbVar1[0xc];
          bVar20 = pbVar1[0xd];
          bVar73 = pbVar1[0xe];
          bVar74 = pbVar1[0xf];
          puVar2 = puVar336 + (ulong)uVar338 + 0x20;
          uVar75 = puVar2[0xb];
          uVar76 = puVar2[0xd];
          uVar77 = puVar2[0xf];
          pbVar1 = puVar336 + (ulong)RGB_stride + 0x10;
          bVar78 = pbVar1[1];
          bVar79 = pbVar1[2];
          bVar19 = pbVar1[3];
          bVar80 = pbVar1[4];
          bVar81 = pbVar1[5];
          bVar82 = pbVar1[6];
          bVar83 = pbVar1[7];
          bVar84 = pbVar1[8];
          bVar18 = pbVar1[9];
          bVar85 = pbVar1[10];
          bVar86 = pbVar1[0xb];
          bVar87 = pbVar1[0xd];
          bVar88 = pbVar1[0xe];
          pbVar3 = puVar336 + (ulong)RGB_stride + 0x20;
          bVar89 = *pbVar3;
          bVar90 = pbVar3[2];
          bVar91 = pbVar3[3];
          bVar92 = pbVar3[6];
          bVar93 = pbVar3[9];
          bVar94 = pbVar3[0xc];
          bVar95 = pbVar3[0xd];
          auVar372._0_14_ = auVar466._0_14_;
          auVar372[0xe] = auVar466[7];
          auVar372[0xf] = bVar21;
          auVar371._14_2_ = auVar372._14_2_;
          auVar371._0_13_ = auVar466._0_13_;
          auVar371[0xd] = bVar34;
          auVar370._13_3_ = auVar371._13_3_;
          auVar370._0_12_ = auVar466._0_12_;
          auVar370[0xc] = auVar466[6];
          auVar369._12_4_ = auVar370._12_4_;
          auVar369._0_11_ = auVar466._0_11_;
          auVar369[0xb] = bVar35;
          bVar386 = auVar466[5];
          auVar368._11_5_ = auVar369._11_5_;
          auVar368._0_10_ = auVar466._0_10_;
          auVar368[10] = bVar386;
          auVar367._10_6_ = auVar368._10_6_;
          auVar367._0_9_ = auVar466._0_9_;
          auVar367[9] = bVar36;
          auVar366._9_7_ = auVar367._9_7_;
          auVar366._0_8_ = auVar466._0_8_;
          auVar366[8] = auVar466[4];
          auVar100._1_8_ = auVar366._8_8_;
          auVar100[0] = bVar6;
          bVar383 = auVar466[3];
          auVar100._9_7_ = 0;
          auVar99._10_6_ = 0;
          auVar99._0_10_ = SUB1610(auVar100 << 0x38,6);
          bVar380 = auVar466[2];
          auVar98._11_5_ = 0;
          auVar98._0_11_ = SUB1611(auVar99 << 0x30,5);
          auVar97._12_4_ = 0;
          auVar97._0_12_ = SUB1612(auVar98 << 0x28,4);
          auVar96._13_3_ = 0;
          auVar96._0_13_ = SUB1613(auVar97 << 0x20,3);
          auVar365._14_2_ = 0;
          auVar365._0_14_ = SUB1614(auVar96 << 0x18,2);
          auVar365 = auVar365 << 0x10;
          auVar412._0_14_ = auVar486._0_14_;
          auVar412[0xe] = auVar486[7];
          auVar412[0xf] = bVar83;
          auVar411._14_2_ = auVar412._14_2_;
          auVar411._0_13_ = auVar486._0_13_;
          auVar411[0xd] = bVar82;
          auVar410._13_3_ = auVar411._13_3_;
          auVar410._0_12_ = auVar486._0_12_;
          auVar410[0xc] = auVar486[6];
          auVar409._12_4_ = auVar410._12_4_;
          auVar409._0_11_ = auVar486._0_11_;
          auVar409[0xb] = bVar81;
          auVar408._11_5_ = auVar409._11_5_;
          auVar408._0_10_ = auVar486._0_10_;
          auVar408[10] = auVar486[5];
          auVar407._10_6_ = auVar408._10_6_;
          auVar407._0_9_ = auVar486._0_9_;
          auVar407[9] = bVar80;
          auVar406._9_7_ = auVar407._9_7_;
          auVar406._0_8_ = auVar486._0_8_;
          auVar406[8] = auVar486[4];
          auVar105._1_8_ = auVar406._8_8_;
          auVar105[0] = bVar19;
          auVar105._9_7_ = 0;
          auVar104._10_6_ = 0;
          auVar104._0_10_ = SUB1610(auVar105 << 0x38,6);
          auVar103._11_5_ = 0;
          auVar103._0_11_ = SUB1611(auVar104 << 0x30,5);
          auVar102._12_4_ = 0;
          auVar102._0_12_ = SUB1612(auVar103 << 0x28,4);
          auVar101._13_3_ = 0;
          auVar101._0_13_ = SUB1613(auVar102 << 0x20,3);
          auVar422._0_14_ = SUB1614(auVar101 << 0x18,2) << 0x10;
          auVar110._1_8_ =
               (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar91,bVar29),
                                                                            puVar2[3]),auVar466[0xb]
                                                                  ),bVar90),bVar30),puVar2[2]),
                               CONCAT11(auVar466[10],bVar29)) >> 8);
          auVar110[0] = pbVar3[1];
          auVar110._9_7_ = 0;
          auVar109._10_6_ = 0;
          auVar109._0_10_ = SUB1610(auVar110 << 0x38,6);
          auVar108._11_5_ = 0;
          auVar108._0_11_ = SUB1611(auVar109 << 0x30,5);
          auVar107._12_4_ = 0;
          auVar107._0_12_ = SUB1612(auVar108 << 0x28,4);
          auVar106._13_3_ = 0;
          auVar106._0_13_ = SUB1613(auVar107 << 0x20,3);
          auVar423._0_14_ = SUB1614(auVar106 << 0x18,2) << 0x10;
          auVar475._0_14_ = auVar365._0_14_;
          auVar475[0xe] = bVar6;
          auVar475[0xf] = bVar86;
          auVar474._14_2_ = auVar475._14_2_;
          auVar474._0_13_ = auVar365._0_13_;
          auVar474[0xd] = auVar486[0xb];
          auVar473._13_3_ = auVar474._13_3_;
          auVar473._0_12_ = auVar365._0_12_;
          auVar473[0xc] = bVar383;
          auVar472._12_4_ = auVar473._12_4_;
          auVar472._0_11_ = auVar365._0_11_;
          auVar472[0xb] = bVar85;
          auVar471._11_5_ = auVar472._11_5_;
          auVar471._0_10_ = auVar365._0_10_;
          auVar471[10] = bVar37;
          auVar470._10_6_ = auVar471._10_6_;
          auVar470._0_9_ = auVar365._0_9_;
          auVar470[9] = auVar486[10];
          auVar469._9_7_ = auVar470._9_7_;
          auVar469._0_8_ = auVar365._0_8_;
          auVar469[8] = bVar380;
          auVar115._1_8_ = auVar469._8_8_;
          auVar115[0] = bVar18;
          auVar115._9_7_ = 0;
          auVar114._10_6_ = 0;
          auVar114._0_10_ = SUB1610(auVar115 << 0x38,6);
          auVar113._11_5_ = 0;
          auVar113._0_11_ = SUB1611(auVar114 << 0x30,5);
          auVar112._12_4_ = 0;
          auVar112._0_12_ = SUB1612(auVar113 << 0x28,4);
          auVar111._13_3_ = 0;
          auVar111._0_13_ = SUB1613(auVar112 << 0x20,3);
          auVar468._14_2_ = 0;
          auVar468._0_14_ = SUB1614(auVar111 << 0x18,2);
          auVar468 = auVar468 << 0x10;
          auVar422[0xe] = bVar19;
          auVar422[0xf] = pbVar3[0xb];
          auVar120._1_8_ =
               (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar93,bVar87),
                                                                            bVar78),bVar35),
                                                          puVar2[9]),auVar486[0xd]),auVar486[1]),
                               CONCAT11(bVar386,bVar87)) >> 8);
          auVar120[0] = pbVar3[8];
          auVar120._9_7_ = 0;
          auVar119._10_6_ = 0;
          auVar119._0_10_ = SUB1610(auVar120 << 0x38,6);
          auVar118._11_5_ = 0;
          auVar118._0_11_ = SUB1611(auVar119 << 0x30,5);
          auVar117._12_4_ = 0;
          auVar117._0_12_ = SUB1612(auVar118 << 0x28,4);
          auVar116._13_3_ = 0;
          auVar116._0_13_ = SUB1613(auVar117 << 0x20,3);
          auVar494._14_2_ = 0;
          auVar494._0_14_ = SUB1614(auVar116 << 0x18,2);
          auVar494 = auVar494 << 0x10;
          auVar423[0xe] = pbVar3[1];
          auVar423[0xf] = bVar95;
          auVar514._0_14_ = auVar468._0_14_;
          auVar514[0xe] = bVar18;
          auVar514[0xf] = pbVar3[5];
          auVar513._14_2_ = auVar514._14_2_;
          auVar513._0_13_ = auVar468._0_13_;
          auVar513[0xd] = bVar20;
          auVar512._13_3_ = auVar513._13_3_;
          auVar512._0_12_ = auVar468._0_12_;
          auVar512[0xc] = bVar13;
          auVar511._12_4_ = auVar512._12_4_;
          auVar511._0_11_ = auVar468._0_11_;
          auVar511[0xb] = puVar2[5];
          auVar510._11_5_ = auVar511._11_5_;
          auVar510._0_10_ = auVar468._0_10_;
          auVar510[10] = auVar486[9];
          auVar509._10_6_ = auVar510._10_6_;
          auVar509._0_9_ = auVar468._0_9_;
          auVar509[9] = auVar466[0xd];
          auVar508._9_7_ = auVar509._9_7_;
          auVar508._0_8_ = auVar468._0_8_;
          auVar508[8] = auVar466[1];
          auVar125._1_8_ = auVar508._8_8_;
          auVar125[0] = pbVar3[4];
          auVar125._9_7_ = 0;
          auVar124._10_6_ = 0;
          auVar124._0_10_ = SUB1610(auVar125 << 0x38,6);
          auVar123._11_5_ = 0;
          auVar123._0_11_ = SUB1611(auVar124 << 0x30,5);
          auVar122._12_4_ = 0;
          auVar122._0_12_ = SUB1612(auVar123 << 0x28,4);
          auVar121._13_3_ = 0;
          auVar121._0_13_ = SUB1613(auVar122 << 0x20,3);
          auVar507._14_2_ = 0;
          auVar507._0_14_ = SUB1614(auVar121 << 0x18,2);
          auVar507 = auVar507 << 0x10;
          uVar224 = CONCAT12(bVar21,CONCAT11(bVar13,uVar75));
          uVar254 = CONCAT13(bVar20,uVar224);
          uVar280 = CONCAT14(bVar19,uVar254);
          auVar307[5] = bVar18;
          auVar307._0_5_ = uVar280;
          auVar130._1_8_ =
               (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar94,bVar92),
                                                                            bVar89),bVar85),bVar80),
                                                 bVar73),bVar32),CONCAT11(bVar37,bVar92)) >> 8);
          auVar130[0] = puVar2[0xc];
          auVar130._9_7_ = 0;
          auVar129._10_6_ = 0;
          auVar129._0_10_ = SUB1610(auVar130 << 0x38,6);
          auVar128._11_5_ = 0;
          auVar128._0_11_ = SUB1611(auVar129 << 0x30,5);
          auVar127._12_4_ = 0;
          auVar127._0_12_ = SUB1612(auVar128 << 0x28,4);
          auVar126._13_3_ = 0;
          auVar126._0_13_ = SUB1613(auVar127 << 0x20,3);
          auVar484._14_2_ = 0;
          auVar484._0_14_ = SUB1614(auVar126 << 0x18,2);
          auVar484 = auVar484 << 0x10;
          uVar225 = CONCAT12(bVar31,CONCAT11(bVar6,uVar76));
          uVar255 = CONCAT13(bVar74,uVar225);
          uVar281 = CONCAT14(bVar81,uVar255);
          auVar309[5] = bVar86;
          auVar309._0_5_ = uVar281;
          auVar349._0_14_ = auVar507._0_14_;
          auVar349[0xe] = pbVar3[4];
          auVar349[0xf] = pbVar3[10];
          auVar348._14_2_ = auVar349._14_2_;
          auVar348._0_13_ = auVar507._0_13_;
          auVar348[0xd] = bVar88;
          auVar347._13_3_ = auVar348._13_3_;
          auVar347._0_12_ = auVar507._0_12_;
          auVar347[0xc] = bVar84;
          auVar346._12_4_ = auVar347._12_4_;
          auVar346._0_11_ = auVar507._0_11_;
          auVar346[0xb] = bVar79;
          auVar345._11_5_ = auVar346._11_5_;
          auVar345._0_10_ = auVar507._0_10_;
          auVar345[10] = bVar22;
          auVar344._10_6_ = auVar345._10_6_;
          auVar344._0_9_ = auVar507._0_9_;
          auVar344[9] = bVar34;
          auVar343._9_7_ = auVar344._9_7_;
          auVar343._0_8_ = auVar507._0_8_;
          auVar343[8] = bVar33;
          auVar135._1_8_ = auVar343._8_8_;
          auVar135[0] = puVar2[10];
          auVar135._9_7_ = 0;
          auVar134._10_6_ = 0;
          auVar134._0_10_ = SUB1610(auVar135 << 0x38,6);
          auVar133._11_5_ = 0;
          auVar133._0_11_ = SUB1611(auVar134 << 0x30,5);
          auVar132._12_4_ = 0;
          auVar132._0_12_ = SUB1612(auVar133 << 0x28,4);
          auVar131._13_3_ = 0;
          auVar131._0_13_ = SUB1613(auVar132 << 0x20,3);
          auVar342._14_2_ = 0;
          auVar342._0_14_ = SUB1614(auVar131 << 0x18,2);
          auVar342 = auVar342 << 0x10;
          auVar456._0_14_ = auVar494._0_14_;
          auVar456[0xe] = pbVar3[8];
          auVar456[0xf] = pbVar3[0xe];
          auVar455._14_2_ = auVar456._14_2_;
          auVar455._0_13_ = auVar494._0_13_;
          auVar455[0xd] = bVar90;
          auVar454._13_3_ = auVar455._13_3_;
          auVar454._0_12_ = auVar494._0_12_;
          auVar454[0xc] = pbVar1[0xc];
          auVar453._12_4_ = auVar454._12_4_;
          auVar453._0_11_ = auVar494._0_11_;
          auVar453[0xb] = bVar82;
          auVar452._11_5_ = auVar453._11_5_;
          auVar452._0_10_ = auVar494._0_10_;
          auVar452[10] = *pbVar1;
          auVar451._10_6_ = auVar452._10_6_;
          auVar451._0_9_ = auVar494._0_9_;
          auVar451[9] = bVar30;
          auVar450._9_7_ = auVar451._9_7_;
          auVar450._0_8_ = auVar494._0_8_;
          auVar450[8] = bVar36;
          auVar140._1_8_ = auVar450._8_8_;
          auVar140[0] = puVar2[0xe];
          auVar140._9_7_ = 0;
          auVar139._10_6_ = 0;
          auVar139._0_10_ = SUB1610(auVar140 << 0x38,6);
          auVar138._11_5_ = 0;
          auVar138._0_11_ = SUB1611(auVar139 << 0x30,5);
          auVar137._12_4_ = 0;
          auVar137._0_12_ = SUB1612(auVar138 << 0x28,4);
          auVar136._13_3_ = 0;
          auVar136._0_13_ = SUB1613(auVar137 << 0x20,3);
          auVar449._14_2_ = 0;
          auVar449._0_14_ = SUB1614(auVar136 << 0x18,2);
          auVar449 = auVar449 << 0x10;
          uVar226 = CONCAT12(bVar29,CONCAT11(bVar35,uVar77));
          uVar256 = CONCAT13(bVar78,uVar226);
          uVar282 = CONCAT14(bVar83,uVar256);
          auVar311[5] = bVar87;
          auVar311._0_5_ = uVar282;
          auVar307._6_8_ = 0;
          auVar40[0xe] = uVar75;
          auVar40._0_14_ = auVar307 << 0x38;
          uVar308 = CONCAT26(auVar40._13_2_,CONCAT15(puVar2[5],uVar280));
          auVar283._4_8_ = 0;
          auVar283._0_4_ = uVar254;
          auVar51._12_3_ = (int3)((ulong)uVar308 >> 0x28);
          auVar51._0_12_ = auVar283 << 0x38;
          uVar284 = CONCAT44(auVar51._11_4_,CONCAT13(auVar486[0xf],uVar224));
          auVar62._10_5_ = (int5)((ulong)uVar284 >> 0x18);
          auVar62._0_10_ = (unkuint10)CONCAT11(bVar13,uVar75) << 0x38;
          uVar227 = CONCAT62(auVar62._9_6_,CONCAT11(auVar486[9],uVar75));
          auVar141._7_8_ = 0;
          auVar141._0_7_ = (uint7)((ulong)uVar227 >> 8);
          Var142 = CONCAT81(SUB158(auVar141 << 0x40,7),auVar486[3]);
          auVar228._9_6_ = 0;
          auVar228._0_9_ = Var142;
          auVar143._1_10_ = SUB1510(auVar228 << 0x30,5);
          auVar143[0] = auVar466[0xd];
          auVar229._11_4_ = 0;
          auVar229._0_11_ = auVar143;
          auVar144._1_12_ = SUB1512(auVar229 << 0x20,3);
          auVar144[0] = auVar466[7];
          auVar41[0xd] = 0;
          auVar41._0_13_ = auVar484._0_13_;
          auVar41[0xe] = puVar2[0xc];
          uVar352 = auVar41._13_2_;
          auVar47[0xc] = puVar2[6];
          auVar47._0_12_ = auVar484._0_12_;
          auVar47._13_2_ = uVar352;
          auVar52[0xb] = 0;
          auVar52._0_11_ = auVar484._0_11_;
          auVar52._12_3_ = auVar47._12_3_;
          auVar58[10] = *puVar2;
          auVar58._0_10_ = auVar484._0_10_;
          auVar58._11_4_ = auVar52._11_4_;
          auVar63[9] = 0;
          auVar63._0_9_ = auVar484._0_9_;
          auVar63._10_5_ = auVar58._10_5_;
          auVar69[8] = auVar486[10];
          auVar69._0_8_ = auVar484._0_8_;
          auVar69._9_6_ = auVar63._9_6_;
          auVar145._7_8_ = 0;
          auVar145._0_7_ = auVar69._8_7_;
          Var146 = CONCAT81(SUB158(auVar145 << 0x40,7),auVar486[4]);
          auVar230._9_6_ = 0;
          auVar230._0_9_ = Var146;
          auVar147._1_10_ = SUB1510(auVar230 << 0x30,5);
          auVar147[0] = auVar466[0xe];
          auVar231._11_4_ = 0;
          auVar231._0_11_ = auVar147;
          auVar148._1_12_ = SUB1512(auVar231 << 0x20,3);
          auVar148[0] = auVar466[8];
          auVar42[0xd] = 0;
          auVar42._0_13_ = auVar342._0_13_;
          auVar42[0xe] = puVar2[10];
          uVar360 = auVar42._13_2_;
          auVar48[0xc] = puVar2[4];
          auVar48._0_12_ = auVar342._0_12_;
          auVar48._13_2_ = uVar360;
          auVar53[0xb] = 0;
          auVar53._0_11_ = auVar342._0_11_;
          auVar53._12_3_ = auVar48._12_3_;
          auVar59[10] = auVar486[0xe];
          auVar59._0_10_ = auVar342._0_10_;
          auVar59._11_4_ = auVar53._11_4_;
          auVar64[9] = 0;
          auVar64._0_9_ = auVar342._0_9_;
          auVar64._10_5_ = auVar59._10_5_;
          auVar70[8] = auVar486[8];
          auVar70._0_8_ = auVar342._0_8_;
          auVar70._9_6_ = auVar64._9_6_;
          auVar149._7_8_ = 0;
          auVar149._0_7_ = auVar70._8_7_;
          Var150 = CONCAT81(SUB158(auVar149 << 0x40,7),auVar486[2]);
          auVar232._9_6_ = 0;
          auVar232._0_9_ = Var150;
          auVar151._1_10_ = SUB1510(auVar232 << 0x30,5);
          auVar151[0] = auVar466[0xc];
          auVar233._11_4_ = 0;
          auVar233._0_11_ = auVar151;
          auVar152._1_12_ = SUB1512(auVar233 << 0x20,3);
          auVar152[0] = auVar466[6];
          local_d8 = auVar353._0_2_;
          sStack_d6 = auVar353._2_2_;
          local_88 = auVar354._0_2_;
          sStack_86 = auVar354._2_2_;
          local_98 = auVar355._0_2_;
          sStack_96 = auVar355._2_2_;
          sVar446 = (short)Var146;
          auVar309._6_8_ = 0;
          auVar43[0xe] = uVar76;
          auVar43._0_14_ = auVar309 << 0x38;
          uVar361 = auVar43._13_2_;
          uVar310 = CONCAT26(uVar361,CONCAT15(puVar2[7],uVar281));
          auVar285._4_8_ = 0;
          auVar285._0_4_ = uVar255;
          auVar54._12_3_ = (int3)((ulong)uVar310 >> 0x28);
          auVar54._0_12_ = auVar285 << 0x38;
          uVar286 = CONCAT44(auVar54._11_4_,CONCAT13(puVar2[1],uVar225));
          auVar65._10_5_ = (int5)((ulong)uVar286 >> 0x18);
          auVar65._0_10_ = (unkuint10)CONCAT11(bVar6,uVar76) << 0x38;
          uVar234 = CONCAT62(auVar65._9_6_,CONCAT11(auVar486[0xb],uVar76));
          auVar153._7_8_ = 0;
          auVar153._0_7_ = (uint7)((ulong)uVar234 >> 8);
          Var146 = CONCAT81(SUB158(auVar153 << 0x40,7),auVar486[5]);
          auVar235._9_6_ = 0;
          auVar235._0_9_ = Var146;
          auVar154._1_10_ = SUB1510(auVar235 << 0x30,5);
          auVar154[0] = auVar466[0xf];
          auVar236._11_4_ = 0;
          auVar236._0_11_ = auVar154;
          auVar155._1_12_ = SUB1512(auVar236 << 0x20,3);
          auVar155[0] = auVar466[9];
          sVar341 = (short)Var150;
          auVar44[0xd] = 0;
          auVar44._0_13_ = auVar449._0_13_;
          auVar44[0xe] = puVar2[0xe];
          auVar49[0xc] = puVar2[8];
          auVar49._0_12_ = auVar449._0_12_;
          auVar49._13_2_ = auVar44._13_2_;
          auVar55[0xb] = 0;
          auVar55._0_11_ = auVar449._0_11_;
          auVar55._12_3_ = auVar49._12_3_;
          auVar60[10] = puVar2[2];
          auVar60._0_10_ = auVar449._0_10_;
          auVar60._11_4_ = auVar55._11_4_;
          auVar66[9] = 0;
          auVar66._0_9_ = auVar449._0_9_;
          auVar66._10_5_ = auVar60._10_5_;
          auVar71[8] = auVar486[0xc];
          auVar71._0_8_ = auVar449._0_8_;
          auVar71._9_6_ = auVar66._9_6_;
          auVar156._7_8_ = 0;
          auVar156._0_7_ = auVar71._8_7_;
          Var150 = CONCAT81(SUB158(auVar156 << 0x40,7),auVar486[6]);
          auVar237._9_6_ = 0;
          auVar237._0_9_ = Var150;
          auVar157._1_10_ = SUB1510(auVar237 << 0x30,5);
          auVar157[0] = auVar486[0];
          auVar238._11_4_ = 0;
          auVar238._0_11_ = auVar157;
          auVar158._1_12_ = SUB1512(auVar238 << 0x20,3);
          auVar158[0] = auVar466[10];
          auVar311._6_8_ = 0;
          auVar45[0xe] = uVar77;
          auVar45._0_14_ = auVar311 << 0x38;
          uVar312 = CONCAT26(auVar45._13_2_,CONCAT15(puVar2[9],uVar282));
          auVar287._4_8_ = 0;
          auVar287._0_4_ = uVar256;
          auVar56._12_3_ = (int3)((ulong)uVar312 >> 0x28);
          auVar56._0_12_ = auVar287 << 0x38;
          uVar288 = CONCAT44(auVar56._11_4_,CONCAT13(puVar2[3],uVar226));
          auVar67._10_5_ = (int5)((ulong)uVar288 >> 0x18);
          auVar67._0_10_ = (unkuint10)CONCAT11(bVar35,uVar77) << 0x38;
          uVar239 = CONCAT62(auVar67._9_6_,CONCAT11(auVar486[0xd],uVar77));
          auVar159._7_8_ = 0;
          auVar159._0_7_ = (uint7)((ulong)uVar239 >> 8);
          Var160 = CONCAT81(SUB158(auVar159 << 0x40,7),auVar486[7]);
          auVar240._9_6_ = 0;
          auVar240._0_9_ = Var160;
          auVar161._1_10_ = SUB1510(auVar240 << 0x30,5);
          auVar161[0] = auVar486[1];
          auVar241._11_4_ = 0;
          auVar241._0_11_ = auVar161;
          auVar162._1_12_ = SUB1512(auVar241 << 0x20,3);
          auVar162[0] = auVar466[0xb];
          sVar491 = (short)Var146;
          sVar492 = (short)((ulong)uVar234 >> 8);
          sVar493 = (short)((ulong)uVar286 >> 0x18);
          sVar497 = (short)((ulong)uVar310 >> 0x28);
          sVar448 = (short)Var160;
          sVar488 = (short)((ulong)uVar239 >> 8);
          sVar489 = (short)((ulong)uVar288 >> 0x18);
          sVar490 = (short)((ulong)uVar312 >> 0x28);
          uVar362 = auVar45._13_2_ >> 8;
          uVar363 = (ushort)(local_98 * (ushort)bVar380 +
                            (ushort)auVar466[1] * local_88 + local_d8 * (ushort)auVar466[0]) >> 8;
          uVar381 = (ushort)(sStack_96 * auVar148._0_2_ +
                            auVar144._0_2_ * sStack_86 + sStack_d6 * auVar152._0_2_) >> 8;
          uVar384 = (ushort)(local_98 * auVar147._0_2_ +
                            auVar143._0_2_ * local_88 + local_d8 * auVar151._0_2_) >> 8;
          uVar387 = (ushort)(sStack_96 * sVar446 + (short)Var142 * sStack_86 + sStack_d6 * sVar341)
                    >> 8;
          uVar389 = (ushort)(local_98 * auVar69._8_2_ +
                            (short)((ulong)uVar227 >> 8) * local_88 + local_d8 * auVar70._8_2_) >> 8
          ;
          uVar391 = (ushort)(sStack_96 * auVar58._10_2_ +
                            (short)((ulong)uVar284 >> 0x18) * sStack_86 + sStack_d6 * auVar59._10_2_
                            ) >> 8;
          uVar393 = (ushort)(local_98 * auVar47._12_2_ +
                            (short)((ulong)uVar308 >> 0x28) * local_88 + local_d8 * auVar48._12_2_)
                    >> 8;
          uVar395 = (ushort)(sStack_96 * (uVar352 >> 8) +
                            (auVar40._13_2_ >> 8) * sStack_86 + sStack_d6 * (uVar360 >> 8)) >> 8;
          uVar405 = (ushort)(local_98 * (ushort)bVar386 +
                            (ushort)auVar466[4] * local_88 + local_d8 * (ushort)bVar383) >> 8;
          uVar414 = (ushort)(sStack_96 * auVar162._0_2_ +
                            auVar158._0_2_ * sStack_86 + sStack_d6 * auVar155._0_2_) >> 8;
          uVar415 = (ushort)(local_98 * auVar161._0_2_ +
                            auVar157._0_2_ * local_88 + local_d8 * auVar154._0_2_) >> 8;
          uVar416 = (ushort)(sStack_96 * sVar448 + (short)Var150 * sStack_86 + sStack_d6 * sVar491)
                    >> 8;
          uVar417 = (ushort)(local_98 * sVar488 + auVar71._8_2_ * local_88 + local_d8 * sVar492) >>
                    8;
          uVar418 = (ushort)(sStack_96 * sVar489 + auVar60._10_2_ * sStack_86 + sStack_d6 * sVar493)
                    >> 8;
          uVar419 = (ushort)(local_98 * sVar490 + auVar49._12_2_ * local_88 + local_d8 * sVar497) >>
                    8;
          uVar420 = (ushort)(sStack_96 * uVar362 +
                            (auVar44._13_2_ >> 8) * sStack_86 + sStack_d6 * (uVar361 >> 8)) >> 8;
          local_e8 = auVar356._0_2_;
          sStack_e6 = auVar356._2_2_;
          uVar421 = (ushort)(local_98 * (ushort)bVar37 +
                            (ushort)bVar13 * local_88 + local_d8 * (ushort)bVar33) >> 8;
          uVar432 = (ushort)(sStack_96 * (ushort)bVar32 +
                            (ushort)bVar21 * sStack_86 + sStack_d6 * (ushort)bVar34) >> 8;
          uVar433 = (ushort)(local_98 * (ushort)bVar73 +
                            (ushort)bVar20 * local_88 + local_d8 * (ushort)bVar22) >> 8;
          uVar434 = (ushort)(sStack_96 * (ushort)bVar80 +
                            (auVar422._14_2_ & 0xff) * sStack_86 + sStack_d6 * (ushort)bVar79) >> 8;
          uVar435 = (ushort)(local_98 * (ushort)bVar85 +
                            (auVar513._14_2_ & 0xff) * local_88 + local_d8 * (ushort)bVar84) >> 8;
          uVar436 = (ushort)(sStack_96 * (ushort)bVar89 +
                            (ushort)pbVar1[0xf] * sStack_86 + sStack_d6 * (ushort)bVar88) >> 8;
          uVar437 = (ushort)(local_98 * (ushort)bVar92 +
                            (auVar513._14_2_ >> 8) * local_88 + local_d8 * (auVar348._14_2_ & 0xff))
                    >> 8;
          uVar438 = (ushort)(sStack_96 * (ushort)bVar94 +
                            (auVar422._14_2_ >> 8) * sStack_86 + sStack_d6 * (auVar348._14_2_ >> 8))
                    >> 8;
          local_a8 = auVar357._0_2_;
          sStack_a6 = auVar357._2_2_;
          sVar397 = ((ushort)(uVar405 * local_e8) >> 7) + local_a8;
          sVar398 = ((ushort)(uVar414 * sStack_e6) >> 7) + sStack_a6;
          sVar399 = ((ushort)(uVar415 * local_e8) >> 7) + local_a8;
          sVar400 = ((ushort)(uVar416 * sStack_e6) >> 7) + sStack_a6;
          sVar401 = ((ushort)(uVar417 * local_e8) >> 7) + local_a8;
          sVar402 = ((ushort)(uVar418 * sStack_e6) >> 7) + sStack_a6;
          sVar403 = ((ushort)(uVar419 * local_e8) >> 7) + local_a8;
          sVar404 = ((ushort)(uVar420 * sStack_e6) >> 7) + sStack_a6;
          sVar364 = ((ushort)(uVar363 * local_e8) >> 7) + local_a8;
          sVar382 = ((ushort)(uVar381 * sStack_e6) >> 7) + sStack_a6;
          sVar385 = ((ushort)(uVar384 * local_e8) >> 7) + local_a8;
          sVar388 = ((ushort)(uVar387 * sStack_e6) >> 7) + sStack_a6;
          sVar390 = ((ushort)(uVar389 * local_e8) >> 7) + local_a8;
          sVar392 = ((ushort)(uVar391 * sStack_e6) >> 7) + sStack_a6;
          sVar394 = ((ushort)(uVar393 * local_e8) >> 7) + local_a8;
          sVar396 = ((ushort)(uVar395 * sStack_e6) >> 7) + sStack_a6;
          bVar6 = (0 < sVar364) * (sVar364 < 0x100) * (char)sVar364 - (0xff < sVar364);
          cVar7 = (0 < sVar382) * (sVar382 < 0x100) * (char)sVar382 - (0xff < sVar382);
          cVar8 = (0 < sVar385) * (sVar385 < 0x100) * (char)sVar385 - (0xff < sVar385);
          cVar9 = (0 < sVar388) * (sVar388 < 0x100) * (char)sVar388 - (0xff < sVar388);
          cVar10 = (0 < sVar390) * (sVar390 < 0x100) * (char)sVar390 - (0xff < sVar390);
          cVar11 = (0 < sVar392) * (sVar392 < 0x100) * (char)sVar392 - (0xff < sVar392);
          cVar12 = (0 < sVar394) * (sVar394 < 0x100) * (char)sVar394 - (0xff < sVar394);
          bVar13 = (0 < sVar396) * (sVar396 < 0x100) * (char)sVar396 - (0xff < sVar396);
          bVar14 = (0 < sVar397) * (sVar397 < 0x100) * (char)sVar397 - (0xff < sVar397);
          bVar15 = (0 < sVar398) * (sVar398 < 0x100) * (char)sVar398 - (0xff < sVar398);
          uVar224 = CONCAT12(bVar15,CONCAT11(bVar14,bVar13));
          bVar16 = (0 < sVar399) * (sVar399 < 0x100) * (char)sVar399 - (0xff < sVar399);
          uVar254 = CONCAT13(bVar16,uVar224);
          bVar17 = (0 < sVar400) * (sVar400 < 0x100) * (char)sVar400 - (0xff < sVar400);
          uVar280 = CONCAT14(bVar17,uVar254);
          bVar18 = (0 < sVar401) * (sVar401 < 0x100) * (char)sVar401 - (0xff < sVar401);
          auVar313[5] = bVar18;
          auVar313._0_5_ = uVar280;
          bVar19 = (0 < sVar402) * (sVar402 < 0x100) * (char)sVar402 - (0xff < sVar402);
          bVar20 = (0 < sVar403) * (sVar403 < 0x100) * (char)sVar403 - (0xff < sVar403);
          bVar21 = (0 < sVar404) * (sVar404 < 0x100) * (char)sVar404 - (0xff < sVar404);
          uVar439 = (ushort)(local_98 * (ushort)bVar35 +
                            (ushort)bVar36 * local_88 + local_d8 * (auVar474._14_2_ & 0xff)) >> 8;
          uVar440 = (ushort)(sStack_96 * (ushort)bVar29 +
                            (ushort)bVar30 * sStack_86 + sStack_d6 * (ushort)bVar31) >> 8;
          uVar441 = (ushort)(local_98 * (ushort)bVar78 +
                            (ushort)*pbVar1 * local_88 + local_d8 * (ushort)bVar74) >> 8;
          uVar442 = (ushort)(sStack_96 * (ushort)bVar83 +
                            (ushort)bVar82 * sStack_86 + sStack_d6 * (ushort)bVar81) >> 8;
          uVar443 = (ushort)(local_98 * (ushort)bVar87 +
                            (ushort)pbVar1[0xc] * local_88 + local_d8 * (ushort)bVar86) >> 8;
          uVar444 = (ushort)(sStack_96 * (ushort)bVar91 +
                            (ushort)bVar90 * sStack_86 + sStack_d6 * (auVar423._14_2_ & 0xff)) >> 8;
          uVar445 = (ushort)(local_98 * (ushort)bVar93 +
                            (auVar455._14_2_ & 0xff) * local_88 + local_d8 * (ushort)pbVar3[7]) >> 8
          ;
          uVar447 = (ushort)(sStack_96 * (ushort)pbVar3[0xf] +
                            (auVar455._14_2_ >> 8) * sStack_86 + sStack_d6 * (ushort)bVar95) >> 8;
          auVar313._6_8_ = 0;
          auVar50[0xe] = bVar13;
          auVar50._0_14_ = auVar313 << 0x38;
          uVar239 = CONCAT26(auVar50._13_2_,CONCAT15(cVar12,uVar280));
          auVar289._4_8_ = 0;
          auVar289._0_4_ = uVar254;
          auVar61._12_3_ = (int3)((ulong)uVar239 >> 0x28);
          auVar61._0_12_ = auVar289 << 0x38;
          uVar234 = CONCAT44(auVar61._11_4_,CONCAT13(cVar11,uVar224));
          auVar72._10_5_ = (int5)((ulong)uVar234 >> 0x18);
          auVar72._0_10_ = (unkuint10)CONCAT11(bVar14,bVar13) << 0x38;
          uVar227 = CONCAT62(auVar72._9_6_,CONCAT11(cVar10,bVar13));
          auVar163._7_8_ = 0;
          auVar163._0_7_ = (uint7)((ulong)uVar227 >> 8);
          Var142 = CONCAT81(SUB158(auVar163 << 0x40,7),cVar9);
          auVar242._9_6_ = 0;
          auVar242._0_9_ = Var142;
          auVar164._1_10_ = SUB1510(auVar242 << 0x30,5);
          auVar164[0] = cVar8;
          auVar243._11_4_ = 0;
          auVar243._0_11_ = auVar164;
          auVar165._1_12_ = SUB1512(auVar243 << 0x20,3);
          auVar165[0] = cVar7;
          sVar364 = uVar405 + uVar363 + uVar439 + uVar421;
          sVar382 = uVar414 + uVar381 + uVar440 + uVar432;
          sVar385 = uVar415 + uVar384 + uVar441 + uVar433;
          sVar388 = uVar416 + uVar387 + uVar442 + uVar434;
          sVar390 = uVar417 + uVar389 + uVar443 + uVar435;
          sVar392 = uVar418 + uVar391 + uVar444 + uVar436;
          sVar394 = uVar419 + uVar393 + uVar445 + uVar437;
          sVar396 = uVar420 + uVar395 + uVar447 + uVar438;
          auVar465._0_2_ =
               ((ushort)bVar386 + (ushort)bVar380 + (ushort)bVar35 + (ushort)bVar37) - sVar364;
          auVar465._2_2_ =
               (auVar162._0_2_ + auVar148._0_2_ + (ushort)bVar29 + (ushort)bVar32) - sVar382;
          auVar465._4_2_ =
               (auVar161._0_2_ + auVar147._0_2_ + (ushort)bVar78 + (ushort)bVar73) - sVar385;
          auVar465._6_2_ = (sVar448 + sVar446 + (ushort)bVar83 + (ushort)bVar80) - sVar388;
          auVar465._8_2_ = (sVar488 + auVar69._8_2_ + (ushort)bVar87 + (ushort)bVar85) - sVar390;
          auVar465._10_2_ = (sVar489 + auVar58._10_2_ + (ushort)bVar91 + (ushort)bVar89) - sVar392;
          auVar465._12_2_ = (sVar490 + auVar47._12_2_ + (ushort)bVar93 + (ushort)bVar92) - sVar394;
          auVar465._14_2_ =
               (uVar362 + (uVar352 >> 8) + (ushort)pbVar3[0xf] + (ushort)bVar94) - sVar396;
          local_c8._2_2_ =
               (auVar155._0_2_ + auVar152._0_2_ + (ushort)bVar31 + (ushort)bVar34) - sVar382;
          local_c8._0_2_ =
               ((ushort)bVar383 + (ushort)auVar466[0] + (auVar474._14_2_ & 0xff) + (ushort)bVar33) -
               sVar364;
          local_c8._4_2_ =
               (auVar154._0_2_ + auVar151._0_2_ + (ushort)bVar74 + (ushort)bVar22) - sVar385;
          local_c8._6_2_ = (sVar491 + sVar341 + (ushort)bVar81 + (ushort)bVar79) - sVar388;
          local_c8._8_2_ = (sVar492 + auVar70._8_2_ + (ushort)bVar86 + (ushort)bVar84) - sVar390;
          local_c8._10_2_ =
               (sVar493 + auVar59._10_2_ + (auVar423._14_2_ & 0xff) + (ushort)bVar88) - sVar392;
          local_c8._12_2_ =
               (sVar497 + auVar48._12_2_ + (ushort)pbVar3[7] + (auVar348._14_2_ & 0xff)) - sVar394;
          local_c8._14_2_ =
               ((uVar361 >> 8) + (uVar360 >> 8) + (ushort)bVar95 + (auVar348._14_2_ >> 8)) - sVar396
          ;
          sVar341 = (short)((ulong)uVar227 >> 8);
          sVar364 = (short)((ulong)uVar234 >> 0x18);
          sVar382 = (short)((ulong)uVar239 >> 0x28);
          sVar385 = ((ushort)(uVar421 * local_e8) >> 7) + local_a8;
          sVar388 = ((ushort)(uVar432 * sStack_e6) >> 7) + sStack_a6;
          sVar390 = ((ushort)(uVar433 * local_e8) >> 7) + local_a8;
          sVar392 = ((ushort)(uVar434 * sStack_e6) >> 7) + sStack_a6;
          sVar394 = ((ushort)(uVar435 * local_e8) >> 7) + local_a8;
          sVar396 = ((ushort)(uVar436 * sStack_e6) >> 7) + sStack_a6;
          sVar397 = ((ushort)(uVar437 * local_e8) >> 7) + local_a8;
          sVar398 = ((ushort)(uVar438 * sStack_e6) >> 7) + sStack_a6;
          uVar362 = (ushort)Var142;
          uVar361 = auVar164._0_2_;
          uVar360 = auVar165._0_2_;
          sVar399 = ((ushort)(uVar439 * local_e8) >> 7) + local_a8;
          sVar400 = ((ushort)(uVar440 * sStack_e6) >> 7) + sStack_a6;
          sVar401 = ((ushort)(uVar441 * local_e8) >> 7) + local_a8;
          sVar402 = ((ushort)(uVar442 * sStack_e6) >> 7) + sStack_a6;
          sVar403 = ((ushort)(uVar443 * local_e8) >> 7) + local_a8;
          sVar404 = ((ushort)(uVar444 * sStack_e6) >> 7) + sStack_a6;
          sVar446 = ((ushort)(uVar445 * local_e8) >> 7) + local_a8;
          sVar448 = ((ushort)(uVar447 * sStack_e6) >> 7) + sStack_a6;
          bVar22 = (0 < sVar385) * (sVar385 < 0x100) * (char)sVar385 - (0xff < sVar385);
          cVar23 = (0 < sVar388) * (sVar388 < 0x100) * (char)sVar388 - (0xff < sVar388);
          cVar24 = (0 < sVar390) * (sVar390 < 0x100) * (char)sVar390 - (0xff < sVar390);
          cVar25 = (0 < sVar392) * (sVar392 < 0x100) * (char)sVar392 - (0xff < sVar392);
          cVar26 = (0 < sVar394) * (sVar394 < 0x100) * (char)sVar394 - (0xff < sVar394);
          cVar27 = (0 < sVar396) * (sVar396 < 0x100) * (char)sVar396 - (0xff < sVar396);
          cVar28 = (0 < sVar397) * (sVar397 < 0x100) * (char)sVar397 - (0xff < sVar397);
          bVar29 = (0 < sVar398) * (sVar398 < 0x100) * (char)sVar398 - (0xff < sVar398);
          bVar30 = (0 < sVar399) * (sVar399 < 0x100) * (char)sVar399 - (0xff < sVar399);
          bVar31 = (0 < sVar400) * (sVar400 < 0x100) * (char)sVar400 - (0xff < sVar400);
          uVar224 = CONCAT12(bVar31,CONCAT11(bVar30,bVar29));
          bVar32 = (0 < sVar401) * (sVar401 < 0x100) * (char)sVar401 - (0xff < sVar401);
          uVar254 = CONCAT13(bVar32,uVar224);
          bVar33 = (0 < sVar402) * (sVar402 < 0x100) * (char)sVar402 - (0xff < sVar402);
          uVar280 = CONCAT14(bVar33,uVar254);
          bVar34 = (0 < sVar403) * (sVar403 < 0x100) * (char)sVar403 - (0xff < sVar403);
          auVar314[5] = bVar34;
          auVar314._0_5_ = uVar280;
          bVar35 = (0 < sVar404) * (sVar404 < 0x100) * (char)sVar404 - (0xff < sVar404);
          bVar36 = (0 < sVar446) * (sVar446 < 0x100) * (char)sVar446 - (0xff < sVar446);
          bVar37 = (0 < sVar448) * (sVar448 < 0x100) * (char)sVar448 - (0xff < sVar448);
          auVar314._6_8_ = 0;
          auVar46[0xe] = bVar29;
          auVar46._0_14_ = auVar314 << 0x38;
          uVar239 = CONCAT26(auVar46._13_2_,CONCAT15(cVar28,uVar280));
          auVar290._4_8_ = 0;
          auVar290._0_4_ = uVar254;
          auVar57._12_3_ = (int3)((ulong)uVar239 >> 0x28);
          auVar57._0_12_ = auVar290 << 0x38;
          uVar234 = CONCAT44(auVar57._11_4_,CONCAT13(cVar27,uVar224));
          auVar68._10_5_ = (int5)((ulong)uVar234 >> 0x18);
          auVar68._0_10_ = (unkuint10)CONCAT11(bVar30,bVar29) << 0x38;
          uVar227 = CONCAT62(auVar68._9_6_,CONCAT11(cVar26,bVar29));
          auVar166._7_8_ = 0;
          auVar166._0_7_ = (uint7)((ulong)uVar227 >> 8);
          Var142 = CONCAT81(SUB158(auVar166 << 0x40,7),cVar25);
          auVar244._9_6_ = 0;
          auVar244._0_9_ = Var142;
          auVar167._1_10_ = SUB1510(auVar244 << 0x30,5);
          auVar167[0] = cVar24;
          auVar245._11_4_ = 0;
          auVar245._0_11_ = auVar167;
          auVar168._1_12_ = SUB1512(auVar245 << 0x20,3);
          auVar168[0] = cVar23;
          uVar352 = (ushort)bVar22;
          puVar2 = Y + lVar337 + uVar340;
          *puVar2 = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
          puVar2[1] = (bVar14 != 0) * (bVar14 < 0x100) * bVar14 - (0xff < bVar14);
          puVar2[2] = (uVar360 != 0) * (uVar360 < 0x100) * cVar7 - (0xff < uVar360);
          puVar2[3] = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
          puVar2[4] = (uVar361 != 0) * (uVar361 < 0x100) * cVar8 - (0xff < uVar361);
          puVar2[5] = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
          puVar2[6] = (uVar362 != 0) * (uVar362 < 0x100) * cVar9 - (0xff < uVar362);
          puVar2[7] = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
          puVar2[8] = (0 < sVar341) * (sVar341 < 0x100) * cVar10 - (0xff < sVar341);
          puVar2[9] = (bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18);
          puVar2[10] = (0 < sVar364) * (sVar364 < 0x100) * cVar11 - (0xff < sVar364);
          puVar2[0xb] = (bVar19 != 0) * (bVar19 < 0x100) * bVar19 - (0xff < bVar19);
          puVar2[0xc] = (0 < sVar382) * (sVar382 < 0x100) * cVar12 - (0xff < sVar382);
          puVar2[0xd] = (bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20);
          puVar2[0xe] = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13);
          puVar2[0xf] = (bVar21 != 0) * (bVar21 < 0x100) * bVar21 - (0xff < bVar21);
          sVar341 = (short)((ulong)uVar227 >> 8);
          sVar364 = (short)((ulong)uVar234 >> 0x18);
          sVar382 = (short)((ulong)uVar239 >> 0x28);
          uVar362 = (ushort)Var142;
          uVar361 = auVar167._0_2_;
          uVar360 = auVar168._0_2_;
          puVar2 = Y + lVar337 + (ulong)Y_stride;
          *puVar2 = (uVar352 != 0) * (uVar352 < 0x100) * bVar22 - (0xff < uVar352);
          puVar2[1] = (bVar30 != 0) * (bVar30 < 0x100) * bVar30 - (0xff < bVar30);
          puVar2[2] = (uVar360 != 0) * (uVar360 < 0x100) * cVar23 - (0xff < uVar360);
          puVar2[3] = (bVar31 != 0) * (bVar31 < 0x100) * bVar31 - (0xff < bVar31);
          puVar2[4] = (uVar361 != 0) * (uVar361 < 0x100) * cVar24 - (0xff < uVar361);
          puVar2[5] = (bVar32 != 0) * (bVar32 < 0x100) * bVar32 - (0xff < bVar32);
          puVar2[6] = (uVar362 != 0) * (uVar362 < 0x100) * cVar25 - (0xff < uVar362);
          puVar2[7] = (bVar33 != 0) * (bVar33 < 0x100) * bVar33 - (0xff < bVar33);
          puVar2[8] = (0 < sVar341) * (sVar341 < 0x100) * cVar26 - (0xff < sVar341);
          puVar2[9] = (bVar34 != 0) * (bVar34 < 0x100) * bVar34 - (0xff < bVar34);
          puVar2[10] = (0 < sVar364) * (sVar364 < 0x100) * cVar27 - (0xff < sVar364);
          puVar2[0xb] = (bVar35 != 0) * (bVar35 < 0x100) * bVar35 - (0xff < bVar35);
          puVar2[0xc] = (0 < sVar382) * (sVar382 < 0x100) * cVar28 - (0xff < sVar382);
          puVar2[0xd] = (bVar36 != 0) * (bVar36 < 0x100) * bVar36 - (0xff < bVar36);
          puVar2[0xe] = (bVar29 != 0) * (bVar29 < 0x100) * bVar29 - (0xff < bVar29);
          puVar2[0xf] = (bVar37 != 0) * (bVar37 < 0x100) * bVar37 - (0xff < bVar37);
          auVar466 = *(undefined1 (*) [16])(puVar336 + (ulong)uVar338 + 0x30);
          puVar2 = puVar336 + (ulong)uVar338 + 0x40;
          puVar4 = puVar336 + (ulong)uVar338 + 0x50;
          bVar13 = puVar4[10];
          bVar6 = puVar4[0xb];
          bVar33 = puVar4[0xc];
          bVar37 = puVar4[0xd];
          bVar21 = puVar4[0xe];
          bVar36 = puVar4[0xf];
          pbVar1 = puVar336 + (ulong)RGB_stride + 0x30;
          bVar35 = *pbVar1;
          bVar20 = pbVar1[1];
          bVar34 = pbVar1[2];
          bVar32 = pbVar1[3];
          bVar19 = pbVar1[4];
          bVar31 = pbVar1[5];
          bVar30 = pbVar1[6];
          bVar18 = pbVar1[7];
          bVar29 = pbVar1[8];
          bVar22 = pbVar1[9];
          bVar73 = pbVar1[0xb];
          bVar74 = pbVar1[0xc];
          bVar16 = pbVar1[0xd];
          bVar78 = pbVar1[0xe];
          bVar79 = pbVar1[0xf];
          pbVar3 = puVar336 + (ulong)RGB_stride + 0x40;
          bVar80 = pbVar3[1];
          bVar81 = pbVar3[2];
          bVar82 = pbVar3[4];
          bVar83 = pbVar3[5];
          bVar84 = pbVar3[7];
          bVar85 = pbVar3[8];
          bVar15 = pbVar3[9];
          bVar86 = pbVar3[10];
          bVar87 = pbVar3[0xb];
          bVar88 = pbVar3[0xd];
          bVar89 = pbVar3[0xe];
          pbVar5 = puVar336 + (ulong)RGB_stride + 0x50;
          bVar90 = *pbVar5;
          bVar91 = pbVar5[4];
          bVar92 = pbVar5[6];
          bVar14 = pbVar5[8];
          bVar93 = pbVar5[9];
          bVar94 = pbVar5[10];
          bVar95 = pbVar5[0xc];
          auVar379._0_14_ = auVar466._0_14_;
          auVar379[0xe] = auVar466[7];
          auVar379[0xf] = bVar18;
          auVar378._14_2_ = auVar379._14_2_;
          auVar378._0_13_ = auVar466._0_13_;
          auVar378[0xd] = bVar30;
          auVar377._13_3_ = auVar378._13_3_;
          auVar377._0_12_ = auVar466._0_12_;
          auVar377[0xc] = auVar466[6];
          auVar376._12_4_ = auVar377._12_4_;
          auVar376._0_11_ = auVar466._0_11_;
          auVar376[0xb] = bVar31;
          bVar386 = auVar466[5];
          auVar375._11_5_ = auVar376._11_5_;
          auVar375._0_10_ = auVar466._0_10_;
          auVar375[10] = bVar386;
          auVar374._10_6_ = auVar375._10_6_;
          auVar374._0_9_ = auVar466._0_9_;
          auVar374[9] = bVar19;
          auVar373._9_7_ = auVar374._9_7_;
          auVar373._0_8_ = auVar466._0_8_;
          auVar373[8] = auVar466[4];
          auVar173._1_8_ = auVar373._8_8_;
          auVar173[0] = bVar32;
          bVar383 = auVar466[3];
          auVar173._9_7_ = 0;
          auVar172._10_6_ = 0;
          auVar172._0_10_ = SUB1610(auVar173 << 0x38,6);
          bVar380 = auVar466[2];
          auVar171._11_5_ = 0;
          auVar171._0_11_ = SUB1611(auVar172 << 0x30,5);
          auVar170._12_4_ = 0;
          auVar170._0_12_ = SUB1612(auVar171 << 0x28,4);
          auVar169._13_3_ = 0;
          auVar169._0_13_ = SUB1613(auVar170 << 0x20,3);
          auVar486._14_2_ = 0;
          auVar486._0_14_ = SUB1614(auVar169 << 0x18,2);
          auVar486 = auVar486 << 0x10;
          auVar483._0_14_ = auVar486._0_14_;
          auVar483[0xe] = bVar32;
          auVar483[0xf] = bVar87;
          auVar482._14_2_ = auVar483._14_2_;
          auVar482._0_13_ = auVar486._0_13_;
          auVar482[0xd] = puVar2[0xb];
          auVar481._13_3_ = auVar482._13_3_;
          auVar481._0_12_ = auVar486._0_12_;
          auVar481[0xc] = bVar383;
          auVar480._12_4_ = auVar481._12_4_;
          auVar480._0_11_ = auVar486._0_11_;
          auVar480[0xb] = bVar86;
          auVar479._11_5_ = auVar480._11_5_;
          auVar479._0_10_ = auVar486._0_10_;
          auVar479[10] = bVar34;
          auVar478._10_6_ = auVar479._10_6_;
          auVar478._0_9_ = auVar486._0_9_;
          auVar478[9] = puVar2[10];
          auVar477._9_7_ = auVar478._9_7_;
          auVar477._0_8_ = auVar486._0_8_;
          auVar477[8] = bVar380;
          auVar178._1_8_ = auVar477._8_8_;
          auVar178[0] = bVar15;
          auVar178._9_7_ = 0;
          auVar177._10_6_ = 0;
          auVar177._0_10_ = SUB1610(auVar178 << 0x38,6);
          auVar176._11_5_ = 0;
          auVar176._0_11_ = SUB1611(auVar177 << 0x30,5);
          auVar175._12_4_ = 0;
          auVar175._0_12_ = SUB1612(auVar176 << 0x28,4);
          auVar174._13_3_ = 0;
          auVar174._0_13_ = SUB1613(auVar175 << 0x20,3);
          auVar476._14_2_ = 0;
          auVar476._0_14_ = SUB1614(auVar174 << 0x18,2);
          auVar476 = auVar476 << 0x10;
          auVar183._1_8_ =
               (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar93,bVar88),
                                                                            bVar80),bVar31),
                                                          puVar4[9]),puVar2[0xd]),puVar2[1]),
                               CONCAT11(bVar386,bVar88)) >> 8);
          auVar183[0] = bVar14;
          auVar183._9_7_ = 0;
          auVar182._10_6_ = 0;
          auVar182._0_10_ = SUB1610(auVar183 << 0x38,6);
          auVar181._11_5_ = 0;
          auVar181._0_11_ = SUB1611(auVar182 << 0x30,5);
          auVar180._12_4_ = 0;
          auVar180._0_12_ = SUB1612(auVar181 << 0x28,4);
          auVar179._13_3_ = 0;
          auVar179._0_13_ = SUB1613(auVar180 << 0x20,3);
          auVar350._14_2_ = 0;
          auVar350._0_14_ = SUB1614(auVar179 << 0x18,2);
          auVar350 = auVar350 << 0x10;
          auVar505._0_14_ = auVar476._0_14_;
          auVar505[0xe] = bVar15;
          auVar505[0xf] = pbVar5[5];
          auVar504._14_2_ = auVar505._14_2_;
          auVar504._0_13_ = auVar476._0_13_;
          auVar504[0xd] = bVar16;
          auVar503._13_3_ = auVar504._13_3_;
          auVar503._0_12_ = auVar476._0_12_;
          auVar503[0xc] = bVar20;
          auVar502._12_4_ = auVar503._12_4_;
          auVar502._0_11_ = auVar476._0_11_;
          auVar502[0xb] = puVar4[5];
          auVar501._11_5_ = auVar502._11_5_;
          auVar501._0_10_ = auVar476._0_10_;
          auVar501[10] = puVar2[9];
          auVar500._10_6_ = auVar501._10_6_;
          auVar500._0_9_ = auVar476._0_9_;
          auVar500[9] = auVar466[0xd];
          auVar499._9_7_ = auVar500._9_7_;
          auVar499._0_8_ = auVar476._0_8_;
          auVar499[8] = auVar466[1];
          auVar188._1_8_ = auVar499._8_8_;
          auVar188[0] = bVar91;
          auVar188._9_7_ = 0;
          auVar187._10_6_ = 0;
          auVar187._0_10_ = SUB1610(auVar188 << 0x38,6);
          auVar186._11_5_ = 0;
          auVar186._0_11_ = SUB1611(auVar187 << 0x30,5);
          auVar185._12_4_ = 0;
          auVar185._0_12_ = SUB1612(auVar186 << 0x28,4);
          auVar184._13_3_ = 0;
          auVar184._0_13_ = SUB1613(auVar185 << 0x20,3);
          auVar498._14_2_ = 0;
          auVar498._0_14_ = SUB1614(auVar184 << 0x18,2);
          auVar498 = auVar498 << 0x10;
          uVar224 = CONCAT12(bVar18,CONCAT11(bVar20,bVar6));
          uVar254 = CONCAT13(bVar16,uVar224);
          uVar280 = CONCAT14(pbVar3[3],uVar254);
          auVar316[5] = bVar15;
          auVar316._0_5_ = uVar280;
          auVar193._1_8_ =
               (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar95,bVar92),
                                                                            bVar90),bVar86),bVar82),
                                                 bVar78),bVar29),CONCAT11(bVar34,bVar92)) >> 8);
          auVar193[0] = bVar33;
          auVar193._9_7_ = 0;
          auVar192._10_6_ = 0;
          auVar192._0_10_ = SUB1610(auVar193 << 0x38,6);
          auVar191._11_5_ = 0;
          auVar191._0_11_ = SUB1611(auVar192 << 0x30,5);
          auVar190._12_4_ = 0;
          auVar190._0_12_ = SUB1612(auVar191 << 0x28,4);
          auVar189._13_3_ = 0;
          auVar189._0_13_ = SUB1613(auVar190 << 0x20,3);
          auVar413._14_2_ = 0;
          auVar413._0_14_ = SUB1614(auVar189 << 0x18,2);
          auVar413 = auVar413 << 0x10;
          uVar225 = CONCAT12(bVar22,CONCAT11(bVar32,bVar37));
          uVar255 = CONCAT13(bVar79,uVar225);
          uVar281 = CONCAT14(bVar83,uVar255);
          auVar319[5] = bVar87;
          auVar319._0_5_ = uVar281;
          auVar464._0_14_ = auVar498._0_14_;
          auVar464[0xe] = bVar91;
          auVar464[0xf] = bVar94;
          auVar463._14_2_ = auVar464._14_2_;
          auVar463._0_13_ = auVar498._0_13_;
          auVar463[0xd] = bVar89;
          auVar462._13_3_ = auVar463._13_3_;
          auVar462._0_12_ = auVar498._0_12_;
          auVar462[0xc] = bVar85;
          auVar461._12_4_ = auVar462._12_4_;
          auVar461._0_11_ = auVar498._0_11_;
          auVar461[0xb] = bVar81;
          auVar460._11_5_ = auVar461._11_5_;
          auVar460._0_10_ = auVar498._0_10_;
          auVar460[10] = bVar74;
          auVar459._10_6_ = auVar460._10_6_;
          auVar459._0_9_ = auVar498._0_9_;
          auVar459[9] = bVar30;
          auVar458._9_7_ = auVar459._9_7_;
          auVar458._0_8_ = auVar498._0_8_;
          auVar458[8] = bVar35;
          auVar198._1_8_ = auVar458._8_8_;
          auVar198[0] = bVar13;
          auVar198._9_7_ = 0;
          auVar197._10_6_ = 0;
          auVar197._0_10_ = SUB1610(auVar198 << 0x38,6);
          auVar196._11_5_ = 0;
          auVar196._0_11_ = SUB1611(auVar197 << 0x30,5);
          auVar195._12_4_ = 0;
          auVar195._0_12_ = SUB1612(auVar196 << 0x28,4);
          auVar194._13_3_ = 0;
          auVar194._0_13_ = SUB1613(auVar195 << 0x20,3);
          auVar457._14_2_ = 0;
          auVar457._0_14_ = SUB1614(auVar194 << 0x18,2);
          auVar457 = auVar457 << 0x10;
          auVar431._0_14_ = auVar350._0_14_;
          auVar431[0xe] = bVar14;
          auVar431[0xf] = pbVar5[0xe];
          auVar430._14_2_ = auVar431._14_2_;
          auVar430._0_13_ = auVar350._0_13_;
          auVar430[0xd] = pbVar5[2];
          auVar429._13_3_ = auVar430._13_3_;
          auVar429._0_12_ = auVar350._0_12_;
          auVar429[0xc] = pbVar3[0xc];
          auVar428._12_4_ = auVar429._12_4_;
          auVar428._0_11_ = auVar350._0_11_;
          auVar428[0xb] = pbVar3[6];
          auVar427._11_5_ = auVar428._11_5_;
          auVar427._0_10_ = auVar350._0_10_;
          auVar427[10] = *pbVar3;
          auVar426._10_6_ = auVar427._10_6_;
          auVar426._0_9_ = auVar350._0_9_;
          auVar426[9] = pbVar1[10];
          auVar425._9_7_ = auVar426._9_7_;
          auVar425._0_8_ = auVar350._0_8_;
          auVar425[8] = bVar19;
          auVar203._1_8_ = auVar425._8_8_;
          auVar203[0] = bVar21;
          auVar203._9_7_ = 0;
          auVar202._10_6_ = 0;
          auVar202._0_10_ = SUB1610(auVar203 << 0x38,6);
          auVar201._11_5_ = 0;
          auVar201._0_11_ = SUB1611(auVar202 << 0x30,5);
          auVar200._12_4_ = 0;
          auVar200._0_12_ = SUB1612(auVar201 << 0x28,4);
          auVar199._13_3_ = 0;
          auVar199._0_13_ = SUB1613(auVar200 << 0x20,3);
          auVar424._14_2_ = 0;
          auVar424._0_14_ = SUB1614(auVar199 << 0x18,2);
          auVar424 = auVar424 << 0x10;
          uVar226 = CONCAT12(bVar73,CONCAT11(bVar31,bVar36));
          uVar256 = CONCAT13(bVar80,uVar226);
          uVar282 = CONCAT14(bVar84,uVar256);
          auVar322[5] = bVar88;
          auVar322._0_5_ = uVar282;
          auVar316._6_8_ = 0;
          auVar246[0xe] = bVar6;
          auVar246._0_14_ = auVar316 << 0x38;
          uVar284 = CONCAT26(auVar246._13_2_,CONCAT15(puVar4[5],uVar280));
          auVar291._4_8_ = 0;
          auVar291._0_4_ = uVar254;
          auVar292._12_3_ = (int3)((ulong)uVar284 >> 0x28);
          auVar292._0_12_ = auVar291 << 0x38;
          uVar227 = CONCAT44(auVar292._11_4_,CONCAT13(puVar2[0xf],uVar224));
          auVar315._10_5_ = (int5)((ulong)uVar227 >> 0x18);
          auVar315._0_10_ = (unkuint10)CONCAT11(bVar20,bVar6) << 0x38;
          uVar328 = CONCAT62(auVar315._9_6_,CONCAT11(puVar2[9],bVar6));
          auVar259._8_8_ = 0;
          auVar259._0_8_ = uVar328 >> 8;
          Var206 = CONCAT91(SUB169(auVar259 << 0x40,7),puVar2[3]);
          auVar258._10_6_ = 0;
          auVar258._0_10_ = Var206;
          auVar205._1_11_ = SUB1611(auVar258 << 0x30,5);
          auVar205[0] = auVar466[0xd];
          auVar257._12_4_ = 0;
          auVar257._0_12_ = auVar205;
          auVar204._1_13_ = SUB1613(auVar257 << 0x20,3);
          auVar204[0] = auVar466[7];
          auVar247[0xd] = 0;
          auVar247._0_13_ = auVar457._0_13_;
          auVar247[0xe] = bVar13;
          auVar262[0xc] = puVar4[4];
          auVar262._0_12_ = auVar457._0_12_;
          auVar262._13_2_ = auVar247._13_2_;
          auVar293[0xb] = 0;
          auVar293._0_11_ = auVar457._0_11_;
          auVar293._12_3_ = auVar262._12_3_;
          auVar304[10] = puVar2[0xe];
          auVar304._0_10_ = auVar457._0_10_;
          auVar304._11_4_ = auVar293._11_4_;
          auVar317[9] = 0;
          auVar317._0_9_ = auVar457._0_9_;
          auVar317._10_5_ = auVar304._10_5_;
          auVar329[8] = puVar2[8];
          auVar329._0_8_ = auVar457._0_8_;
          auVar329._9_6_ = auVar317._9_6_;
          Var209 = CONCAT91(SUB169(ZEXT716(auVar329._8_7_) << 0x40,7),puVar2[2]);
          auVar261._10_6_ = 0;
          auVar261._0_10_ = Var209;
          auVar208._1_11_ = SUB1611(auVar261 << 0x30,5);
          auVar208[0] = auVar466[0xc];
          auVar260._12_4_ = 0;
          auVar260._0_12_ = auVar208;
          auVar207._1_13_ = SUB1613(auVar260 << 0x20,3);
          auVar207[0] = auVar466[6];
          auVar319._6_8_ = 0;
          auVar248[0xe] = bVar37;
          auVar248._0_14_ = auVar319 << 0x38;
          uVar286 = CONCAT26(auVar248._13_2_,CONCAT15(puVar4[7],uVar281));
          auVar294._4_8_ = 0;
          auVar294._0_4_ = uVar255;
          auVar295._12_3_ = (int3)((ulong)uVar286 >> 0x28);
          auVar295._0_12_ = auVar294 << 0x38;
          uVar234 = CONCAT44(auVar295._11_4_,CONCAT13(puVar4[1],uVar225));
          auVar318._10_5_ = (int5)((ulong)uVar234 >> 0x18);
          auVar318._0_10_ = (unkuint10)CONCAT11(bVar32,bVar37) << 0x38;
          uVar330 = CONCAT62(auVar318._9_6_,CONCAT11(puVar2[0xb],bVar37));
          auVar265._8_8_ = 0;
          auVar265._0_8_ = uVar330 >> 8;
          Var212 = CONCAT91(SUB169(auVar265 << 0x40,7),puVar2[5]);
          auVar264._10_6_ = 0;
          auVar264._0_10_ = Var212;
          auVar211._1_11_ = SUB1611(auVar264 << 0x30,5);
          auVar211[0] = auVar466[0xf];
          auVar263._12_4_ = 0;
          auVar263._0_12_ = auVar211;
          auVar210._1_13_ = SUB1613(auVar263 << 0x20,3);
          auVar210[0] = auVar466[9];
          sVar396 = (short)Var209;
          auVar249[0xd] = 0;
          auVar249._0_13_ = auVar424._0_13_;
          auVar249[0xe] = bVar21;
          auVar268[0xc] = puVar4[8];
          auVar268._0_12_ = auVar424._0_12_;
          auVar268._13_2_ = auVar249._13_2_;
          auVar296[0xb] = 0;
          auVar296._0_11_ = auVar424._0_11_;
          auVar296._12_3_ = auVar268._12_3_;
          auVar305[10] = puVar4[2];
          auVar305._0_10_ = auVar424._0_10_;
          auVar305._11_4_ = auVar296._11_4_;
          auVar320[9] = 0;
          auVar320._0_9_ = auVar424._0_9_;
          auVar320._10_5_ = auVar305._10_5_;
          auVar331[8] = puVar2[0xc];
          auVar331._0_8_ = auVar424._0_8_;
          auVar331._9_6_ = auVar320._9_6_;
          Var209 = CONCAT91(SUB169(ZEXT716(auVar331._8_7_) << 0x40,7),puVar2[6]);
          auVar267._10_6_ = 0;
          auVar267._0_10_ = Var209;
          auVar214._1_11_ = SUB1611(auVar267 << 0x30,5);
          auVar214[0] = *puVar2;
          auVar266._12_4_ = 0;
          auVar266._0_12_ = auVar214;
          auVar213._1_13_ = SUB1613(auVar266 << 0x20,3);
          auVar213[0] = auVar466[10];
          auVar322._6_8_ = 0;
          auVar250[0xe] = bVar36;
          auVar250._0_14_ = auVar322 << 0x38;
          uVar288 = CONCAT26(auVar250._13_2_,CONCAT15(puVar4[9],uVar282));
          auVar297._4_8_ = 0;
          auVar297._0_4_ = uVar256;
          auVar298._12_3_ = (int3)((ulong)uVar288 >> 0x28);
          auVar298._0_12_ = auVar297 << 0x38;
          uVar239 = CONCAT44(auVar298._11_4_,CONCAT13(puVar4[3],uVar226));
          auVar321._10_5_ = (int5)((ulong)uVar239 >> 0x18);
          auVar321._0_10_ = (unkuint10)CONCAT11(bVar31,bVar36) << 0x38;
          uVar332 = CONCAT62(auVar321._9_6_,CONCAT11(puVar2[0xd],bVar36));
          auVar271._8_8_ = 0;
          auVar271._0_8_ = uVar332 >> 8;
          Var217 = CONCAT91(SUB169(auVar271 << 0x40,7),puVar2[7]);
          auVar270._10_6_ = 0;
          auVar270._0_10_ = Var217;
          auVar216._1_11_ = SUB1611(auVar270 << 0x30,5);
          auVar216[0] = puVar2[1];
          auVar269._12_4_ = 0;
          auVar269._0_12_ = auVar216;
          auVar215._1_13_ = SUB1613(auVar269 << 0x20,3);
          auVar215[0] = auVar466[0xb];
          sVar448 = (short)Var212;
          sVar488 = (short)(uVar330 >> 8);
          sVar489 = (short)((ulong)uVar234 >> 0x18);
          sVar490 = (short)((ulong)uVar286 >> 0x28);
          sVar491 = (short)Var217;
          sVar492 = (short)(uVar332 >> 8);
          sVar493 = (short)((ulong)uVar239 >> 0x18);
          sVar497 = (short)((ulong)uVar288 >> 0x28);
          auVar251[0xd] = 0;
          auVar251._0_13_ = auVar413._0_13_;
          auVar251[0xe] = bVar33;
          auVar274[0xc] = puVar4[6];
          auVar274._0_12_ = auVar413._0_12_;
          auVar274._13_2_ = auVar251._13_2_;
          auVar299[0xb] = 0;
          auVar299._0_11_ = auVar413._0_11_;
          auVar299._12_3_ = auVar274._12_3_;
          auVar306[10] = *puVar4;
          auVar306._0_10_ = auVar413._0_10_;
          auVar306._11_4_ = auVar299._11_4_;
          auVar323[9] = 0;
          auVar323._0_9_ = auVar413._0_9_;
          auVar323._10_5_ = auVar306._10_5_;
          auVar333[8] = puVar2[10];
          auVar333._0_8_ = auVar413._0_8_;
          auVar333._9_6_ = auVar323._9_6_;
          Var212 = CONCAT91(SUB169(ZEXT716(auVar333._8_7_) << 0x40,7),puVar2[4]);
          auVar273._10_6_ = 0;
          auVar273._0_10_ = Var212;
          auVar219._1_11_ = SUB1611(auVar273 << 0x30,5);
          auVar219[0] = auVar466[0xe];
          auVar272._12_4_ = 0;
          auVar272._0_12_ = auVar219;
          auVar218._1_13_ = SUB1613(auVar272 << 0x20,3);
          auVar218[0] = auVar466[8];
          sVar400 = (short)Var212;
          uVar435 = (ushort)(local_98 * (ushort)bVar386 +
                            (ushort)auVar466[4] * local_88 + local_d8 * (ushort)bVar383) >> 8;
          uVar436 = (ushort)(sStack_96 * auVar215._0_2_ +
                            auVar213._0_2_ * sStack_86 + sStack_d6 * auVar210._0_2_) >> 8;
          uVar437 = (ushort)(local_98 * auVar216._0_2_ +
                            auVar214._0_2_ * local_88 + local_d8 * auVar211._0_2_) >> 8;
          uVar438 = (ushort)(sStack_96 * sVar491 + (short)Var209 * sStack_86 + sStack_d6 * sVar448)
                    >> 8;
          uVar439 = (ushort)(local_98 * sVar492 + auVar331._8_2_ * local_88 + local_d8 * sVar488) >>
                    8;
          uVar440 = (ushort)(sStack_96 * sVar493 + auVar305._10_2_ * sStack_86 + sStack_d6 * sVar489
                            ) >> 8;
          uVar441 = (ushort)(local_98 * sVar497 + auVar268._12_2_ * local_88 + local_d8 * sVar490)
                    >> 8;
          uVar442 = (ushort)(sStack_96 * (ushort)bVar36 +
                            (ushort)bVar21 * sStack_86 + sStack_d6 * (ushort)bVar37) >> 8;
          uVar389 = (ushort)(local_98 * (ushort)bVar34 +
                            (ushort)bVar20 * local_88 + local_d8 * (ushort)bVar35) >> 8;
          uVar391 = (ushort)(sStack_96 * (ushort)bVar29 +
                            (ushort)bVar18 * sStack_86 + sStack_d6 * (ushort)bVar30) >> 8;
          uVar393 = (ushort)(local_98 * (ushort)bVar78 +
                            (ushort)bVar16 * local_88 + local_d8 * (ushort)bVar74) >> 8;
          uVar395 = (ushort)(sStack_96 * (ushort)bVar82 +
                            (ushort)pbVar3[3] * sStack_86 + sStack_d6 * (ushort)bVar81) >> 8;
          uVar405 = (ushort)(local_98 * (ushort)bVar86 +
                            (ushort)bVar15 * local_88 + local_d8 * (ushort)bVar85) >> 8;
          uVar414 = (ushort)(sStack_96 * (ushort)bVar90 +
                            (ushort)pbVar3[0xf] * sStack_86 + sStack_d6 * (ushort)bVar89) >> 8;
          uVar415 = (ushort)(local_98 * (ushort)bVar92 +
                            (ushort)pbVar5[5] * local_88 + local_d8 * (ushort)bVar91) >> 8;
          uVar416 = (ushort)(sStack_96 * (ushort)bVar95 +
                            (ushort)pbVar5[0xb] * sStack_86 + sStack_d6 * (ushort)bVar94) >> 8;
          uVar352 = (ushort)(local_98 * (ushort)bVar380 +
                            (ushort)auVar466[1] * local_88 + local_d8 * (ushort)auVar466[0]) >> 8;
          uVar360 = (ushort)(sStack_96 * auVar218._0_2_ +
                            auVar204._0_2_ * sStack_86 + sStack_d6 * auVar207._0_2_) >> 8;
          uVar361 = (ushort)(local_98 * auVar219._0_2_ +
                            auVar205._0_2_ * local_88 + local_d8 * auVar208._0_2_) >> 8;
          uVar362 = (ushort)(sStack_96 * sVar400 + (short)Var206 * sStack_86 + sStack_d6 * sVar396)
                    >> 8;
          uVar363 = (ushort)(local_98 * auVar333._8_2_ +
                            (short)(uVar328 >> 8) * local_88 + local_d8 * auVar329._8_2_) >> 8;
          uVar381 = (ushort)(sStack_96 * auVar306._10_2_ +
                            (short)((ulong)uVar227 >> 0x18) * sStack_86 +
                            sStack_d6 * auVar304._10_2_) >> 8;
          uVar384 = (ushort)(local_98 * auVar274._12_2_ +
                            (short)((ulong)uVar284 >> 0x28) * local_88 + local_d8 * auVar262._12_2_)
                    >> 8;
          uVar387 = (ushort)(sStack_96 * (ushort)bVar33 +
                            (ushort)bVar6 * sStack_86 + sStack_d6 * (ushort)bVar13) >> 8;
          uVar417 = (ushort)(local_98 * (ushort)bVar31 +
                            (ushort)bVar19 * local_88 + local_d8 * (ushort)bVar32) >> 8;
          uVar418 = (ushort)(sStack_96 * (ushort)bVar73 +
                            (ushort)pbVar1[10] * sStack_86 + sStack_d6 * (ushort)bVar22) >> 8;
          uVar419 = (ushort)(local_98 * (ushort)bVar80 +
                            (ushort)*pbVar3 * local_88 + local_d8 * (ushort)bVar79) >> 8;
          uVar420 = (ushort)(sStack_96 * (ushort)bVar84 +
                            (ushort)pbVar3[6] * sStack_86 + sStack_d6 * (ushort)bVar83) >> 8;
          uVar421 = (ushort)(local_98 * (ushort)bVar88 +
                            (ushort)pbVar3[0xc] * local_88 + local_d8 * (ushort)bVar87) >> 8;
          uVar432 = (ushort)(sStack_96 * (ushort)pbVar5[3] +
                            (ushort)pbVar5[2] * sStack_86 + sStack_d6 * (ushort)pbVar5[1]) >> 8;
          uVar433 = (ushort)(local_98 * (ushort)bVar93 +
                            (ushort)bVar14 * local_88 + local_d8 * (ushort)pbVar5[7]) >> 8;
          uVar434 = (ushort)(sStack_96 * (ushort)pbVar5[0xf] +
                            (ushort)pbVar5[0xe] * sStack_86 + sStack_d6 * (ushort)pbVar5[0xd]) >> 8;
          sVar506 = uVar435 + uVar352 + uVar417 + uVar389;
          sVar515 = uVar436 + uVar360 + uVar418 + uVar391;
          sVar516 = uVar437 + uVar361 + uVar419 + uVar393;
          sVar517 = uVar438 + uVar362 + uVar420 + uVar395;
          sVar518 = uVar439 + uVar363 + uVar421 + uVar405;
          sVar519 = uVar440 + uVar381 + uVar432 + uVar414;
          sVar520 = uVar441 + uVar384 + uVar433 + uVar415;
          sVar521 = uVar442 + uVar387 + uVar434 + uVar416;
          sVar397 = ((ushort)(uVar352 * local_e8) >> 7) + local_a8;
          sVar398 = ((ushort)(uVar360 * sStack_e6) >> 7) + sStack_a6;
          sVar399 = ((ushort)(uVar361 * local_e8) >> 7) + local_a8;
          sVar401 = ((ushort)(uVar362 * sStack_e6) >> 7) + sStack_a6;
          sVar402 = ((ushort)(uVar363 * local_e8) >> 7) + local_a8;
          sVar403 = ((ushort)(uVar381 * sStack_e6) >> 7) + sStack_a6;
          sVar404 = ((ushort)(uVar384 * local_e8) >> 7) + local_a8;
          sVar446 = ((ushort)(uVar387 * sStack_e6) >> 7) + sStack_a6;
          sVar341 = ((ushort)(uVar435 * local_e8) >> 7) + local_a8;
          sVar364 = ((ushort)(uVar436 * sStack_e6) >> 7) + sStack_a6;
          sVar382 = ((ushort)(uVar437 * local_e8) >> 7) + local_a8;
          sVar385 = ((ushort)(uVar438 * sStack_e6) >> 7) + sStack_a6;
          sVar388 = ((ushort)(uVar439 * local_e8) >> 7) + local_a8;
          sVar390 = ((ushort)(uVar440 * sStack_e6) >> 7) + sStack_a6;
          sVar392 = ((ushort)(uVar441 * local_e8) >> 7) + local_a8;
          sVar394 = ((ushort)(uVar442 * sStack_e6) >> 7) + sStack_a6;
          bVar13 = (0 < sVar397) * (sVar397 < 0x100) * (char)sVar397 - (0xff < sVar397);
          cVar8 = (0 < sVar398) * (sVar398 < 0x100) * (char)sVar398 - (0xff < sVar398);
          cVar7 = (0 < sVar399) * (sVar399 < 0x100) * (char)sVar399 - (0xff < sVar399);
          cVar12 = (0 < sVar401) * (sVar401 < 0x100) * (char)sVar401 - (0xff < sVar401);
          cVar11 = (0 < sVar402) * (sVar402 < 0x100) * (char)sVar402 - (0xff < sVar402);
          cVar10 = (0 < sVar403) * (sVar403 < 0x100) * (char)sVar403 - (0xff < sVar403);
          cVar9 = (0 < sVar404) * (sVar404 < 0x100) * (char)sVar404 - (0xff < sVar404);
          bVar17 = (0 < sVar446) * (sVar446 < 0x100) * (char)sVar446 - (0xff < sVar446);
          bVar14 = (0 < sVar341) * (sVar341 < 0x100) * (char)sVar341 - (0xff < sVar341);
          bVar15 = (0 < sVar364) * (sVar364 < 0x100) * (char)sVar364 - (0xff < sVar364);
          uVar224 = CONCAT12(bVar15,CONCAT11(bVar14,bVar17));
          bVar16 = (0 < sVar382) * (sVar382 < 0x100) * (char)sVar382 - (0xff < sVar382);
          uVar254 = CONCAT13(bVar16,uVar224);
          bVar18 = (0 < sVar385) * (sVar385 < 0x100) * (char)sVar385 - (0xff < sVar385);
          uVar280 = CONCAT14(bVar18,uVar254);
          bVar19 = (0 < sVar388) * (sVar388 < 0x100) * (char)sVar388 - (0xff < sVar388);
          auVar325[5] = bVar19;
          auVar325._0_5_ = uVar280;
          bVar20 = (0 < sVar390) * (sVar390 < 0x100) * (char)sVar390 - (0xff < sVar390);
          bVar21 = (0 < sVar392) * (sVar392 < 0x100) * (char)sVar392 - (0xff < sVar392);
          bVar6 = (0 < sVar394) * (sVar394 < 0x100) * (char)sVar394 - (0xff < sVar394);
          auVar325._6_8_ = 0;
          auVar252[0xe] = bVar17;
          auVar252._0_14_ = auVar325 << 0x38;
          uVar234 = CONCAT26(auVar252._13_2_,CONCAT15(cVar9,uVar280));
          auVar300._4_8_ = 0;
          auVar300._0_4_ = uVar254;
          auVar301._12_3_ = (int3)((ulong)uVar234 >> 0x28);
          auVar301._0_12_ = auVar300 << 0x38;
          uVar227 = CONCAT44(auVar301._11_4_,CONCAT13(cVar10,uVar224));
          auVar324._10_5_ = (int5)((ulong)uVar227 >> 0x18);
          auVar324._0_10_ = (unkuint10)CONCAT11(bVar14,bVar17) << 0x38;
          uVar328 = CONCAT62(auVar324._9_6_,CONCAT11(cVar11,bVar17));
          auVar277._8_8_ = 0;
          auVar277._0_8_ = uVar328 >> 8;
          Var206 = CONCAT91(SUB169(auVar277 << 0x40,7),cVar12);
          auVar276._10_6_ = 0;
          auVar276._0_10_ = Var206;
          auVar221._1_11_ = SUB1611(auVar276 << 0x30,5);
          auVar221[0] = cVar7;
          auVar275._12_4_ = 0;
          auVar275._0_12_ = auVar221;
          auVar220._1_13_ = SUB1613(auVar275 << 0x20,3);
          auVar220[0] = cVar8;
          uVar363 = (ushort)bVar13;
          uVar352 = (ushort)bVar14;
          sVar341 = (short)(uVar328 >> 8);
          sVar364 = (short)((ulong)uVar227 >> 0x18);
          sVar382 = (short)((ulong)uVar234 >> 0x28);
          uVar362 = (ushort)bVar18;
          uVar387 = (ushort)Var206;
          uVar361 = (ushort)bVar16;
          uVar384 = auVar221._0_2_;
          uVar360 = (ushort)bVar15;
          uVar381 = auVar220._0_2_;
          auVar495._0_2_ =
               ((ushort)bVar386 + (ushort)bVar380 + (ushort)bVar31 + (ushort)bVar34) - sVar506;
          auVar495._2_2_ =
               (auVar215._0_2_ + auVar218._0_2_ + (ushort)bVar73 + (ushort)bVar29) - sVar515;
          auVar495._4_2_ =
               (auVar216._0_2_ + auVar219._0_2_ + (ushort)bVar80 + (ushort)bVar78) - sVar516;
          auVar495._6_2_ = (sVar491 + sVar400 + (ushort)bVar84 + (ushort)bVar82) - sVar517;
          auVar495._8_2_ = (sVar492 + auVar333._8_2_ + (ushort)bVar88 + (ushort)bVar86) - sVar518;
          auVar495._10_2_ =
               (sVar493 + auVar306._10_2_ + (ushort)pbVar5[3] + (ushort)bVar90) - sVar519;
          auVar495._12_2_ = (sVar497 + auVar274._12_2_ + (ushort)bVar93 + (ushort)bVar92) - sVar520;
          auVar495._14_2_ =
               ((ushort)bVar36 + (ushort)bVar33 + (ushort)pbVar5[0xf] + (ushort)bVar95) - sVar521;
          auVar485._0_2_ =
               ((ushort)bVar383 + (ushort)auVar466[0] + (ushort)bVar32 + (ushort)bVar35) - sVar506;
          auVar485._2_2_ =
               (auVar210._0_2_ + auVar207._0_2_ + (ushort)bVar22 + (ushort)bVar30) - sVar515;
          auVar485._4_2_ =
               (auVar211._0_2_ + auVar208._0_2_ + (ushort)bVar79 + (ushort)bVar74) - sVar516;
          auVar485._6_2_ = (sVar448 + sVar396 + (ushort)bVar83 + (ushort)bVar81) - sVar517;
          auVar485._8_2_ = (sVar488 + auVar329._8_2_ + (ushort)bVar87 + (ushort)bVar85) - sVar518;
          auVar485._10_2_ =
               (sVar489 + auVar304._10_2_ + (ushort)pbVar5[1] + (ushort)bVar89) - sVar519;
          auVar485._12_2_ =
               (sVar490 + auVar262._12_2_ + (ushort)pbVar5[7] + (ushort)bVar91) - sVar520;
          auVar485._14_2_ =
               ((ushort)bVar37 + (auVar247._13_2_ >> 8) + (ushort)pbVar5[0xd] + (ushort)bVar94) -
               sVar521;
          sVar385 = ((ushort)(uVar389 * local_e8) >> 7) + local_a8;
          sVar388 = ((ushort)(uVar391 * sStack_e6) >> 7) + sStack_a6;
          sVar390 = ((ushort)(uVar393 * local_e8) >> 7) + local_a8;
          sVar392 = ((ushort)(uVar395 * sStack_e6) >> 7) + sStack_a6;
          sVar394 = ((ushort)(uVar405 * local_e8) >> 7) + local_a8;
          sVar396 = ((ushort)(uVar414 * sStack_e6) >> 7) + sStack_a6;
          sVar397 = ((ushort)(uVar415 * local_e8) >> 7) + local_a8;
          sVar398 = ((ushort)(uVar416 * sStack_e6) >> 7) + sStack_a6;
          sVar399 = ((ushort)(uVar417 * local_e8) >> 7) + local_a8;
          sVar400 = ((ushort)(uVar418 * sStack_e6) >> 7) + sStack_a6;
          sVar401 = ((ushort)(uVar419 * local_e8) >> 7) + local_a8;
          sVar402 = ((ushort)(uVar420 * sStack_e6) >> 7) + sStack_a6;
          sVar403 = ((ushort)(uVar421 * local_e8) >> 7) + local_a8;
          sVar404 = ((ushort)(uVar432 * sStack_e6) >> 7) + sStack_a6;
          local_a8 = ((ushort)(uVar433 * local_e8) >> 7) + local_a8;
          sStack_a6 = ((ushort)(uVar434 * sStack_e6) >> 7) + sStack_a6;
          bVar29 = (0 < sVar385) * (sVar385 < 0x100) * (char)sVar385 - (0xff < sVar385);
          cVar23 = (0 < sVar388) * (sVar388 < 0x100) * (char)sVar388 - (0xff < sVar388);
          cVar24 = (0 < sVar390) * (sVar390 < 0x100) * (char)sVar390 - (0xff < sVar390);
          cVar25 = (0 < sVar392) * (sVar392 < 0x100) * (char)sVar392 - (0xff < sVar392);
          cVar26 = (0 < sVar394) * (sVar394 < 0x100) * (char)sVar394 - (0xff < sVar394);
          cVar27 = (0 < sVar396) * (sVar396 < 0x100) * (char)sVar396 - (0xff < sVar396);
          cVar28 = (0 < sVar397) * (sVar397 < 0x100) * (char)sVar397 - (0xff < sVar397);
          bVar30 = (0 < sVar398) * (sVar398 < 0x100) * (char)sVar398 - (0xff < sVar398);
          bVar31 = (0 < sVar399) * (sVar399 < 0x100) * (char)sVar399 - (0xff < sVar399);
          bVar35 = (0 < sVar400) * (sVar400 < 0x100) * (char)sVar400 - (0xff < sVar400);
          uVar224 = CONCAT12(bVar35,CONCAT11(bVar31,bVar30));
          bVar32 = (0 < sVar401) * (sVar401 < 0x100) * (char)sVar401 - (0xff < sVar401);
          uVar254 = CONCAT13(bVar32,uVar224);
          bVar22 = (0 < sVar402) * (sVar402 < 0x100) * (char)sVar402 - (0xff < sVar402);
          uVar280 = CONCAT14(bVar22,uVar254);
          bVar34 = (0 < sVar403) * (sVar403 < 0x100) * (char)sVar403 - (0xff < sVar403);
          auVar327[5] = bVar34;
          auVar327._0_5_ = uVar280;
          bVar36 = (0 < sVar404) * (sVar404 < 0x100) * (char)sVar404 - (0xff < sVar404);
          bVar37 = (0 < local_a8) * (local_a8 < 0x100) * (char)local_a8 - (0xff < local_a8);
          bVar33 = (0 < sStack_a6) * (sStack_a6 < 0x100) * (char)sStack_a6 - (0xff < sStack_a6);
          puVar2 = Y + lVar337 + uVar340 + 0x10;
          *puVar2 = (uVar363 != 0) * (uVar363 < 0x100) * bVar13 - (0xff < uVar363);
          puVar2[1] = (uVar352 != 0) * (uVar352 < 0x100) * bVar14 - (0xff < uVar352);
          puVar2[2] = (uVar381 != 0) * (uVar381 < 0x100) * cVar8 - (0xff < uVar381);
          puVar2[3] = (uVar360 != 0) * (uVar360 < 0x100) * bVar15 - (0xff < uVar360);
          puVar2[4] = (uVar384 != 0) * (uVar384 < 0x100) * cVar7 - (0xff < uVar384);
          puVar2[5] = (uVar361 != 0) * (uVar361 < 0x100) * bVar16 - (0xff < uVar361);
          puVar2[6] = (uVar387 != 0) * (uVar387 < 0x100) * cVar12 - (0xff < uVar387);
          puVar2[7] = (uVar362 != 0) * (uVar362 < 0x100) * bVar18 - (0xff < uVar362);
          puVar2[8] = (0 < sVar341) * (sVar341 < 0x100) * cVar11 - (0xff < sVar341);
          puVar2[9] = (bVar19 != 0) * (bVar19 < 0x100) * bVar19 - (0xff < bVar19);
          puVar2[10] = (0 < sVar364) * (sVar364 < 0x100) * cVar10 - (0xff < sVar364);
          puVar2[0xb] = (bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20);
          puVar2[0xc] = (0 < sVar382) * (sVar382 < 0x100) * cVar9 - (0xff < sVar382);
          puVar2[0xd] = (bVar21 != 0) * (bVar21 < 0x100) * bVar21 - (0xff < bVar21);
          puVar2[0xe] = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
          puVar2[0xf] = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
          uVar352 = (ushort)bVar31;
          auVar327._6_8_ = 0;
          auVar253[0xe] = bVar30;
          auVar253._0_14_ = auVar327 << 0x38;
          uVar234 = CONCAT26(auVar253._13_2_,CONCAT15(cVar28,uVar280));
          auVar302._4_8_ = 0;
          auVar302._0_4_ = uVar254;
          auVar303._12_3_ = (int3)((ulong)uVar234 >> 0x28);
          auVar303._0_12_ = auVar302 << 0x38;
          uVar227 = CONCAT44(auVar303._11_4_,CONCAT13(cVar27,uVar224));
          auVar326._10_5_ = (int5)((ulong)uVar227 >> 0x18);
          auVar326._0_10_ = (unkuint10)CONCAT11(bVar31,bVar30) << 0x38;
          uVar328 = CONCAT62(auVar326._9_6_,CONCAT11(cVar26,bVar30));
          auVar279._8_8_ = 0;
          auVar279._0_8_ = uVar328 >> 8;
          Var206 = CONCAT91(SUB169(auVar279 << 0x40,7),cVar25);
          auVar278._10_6_ = 0;
          auVar278._0_10_ = Var206;
          auVar223._1_11_ = SUB1611(auVar278 << 0x30,5);
          auVar223[0] = cVar24;
          auVar466._12_4_ = 0;
          auVar466._0_12_ = auVar223;
          auVar222._1_13_ = SUB1613(auVar466 << 0x20,3);
          auVar222[0] = cVar23;
          uVar363 = (ushort)bVar29;
          sVar341 = (short)(uVar328 >> 8);
          sVar364 = (short)((ulong)uVar227 >> 0x18);
          sVar382 = (short)((ulong)uVar234 >> 0x28);
          uVar362 = (ushort)bVar22;
          uVar387 = (ushort)Var206;
          uVar361 = (ushort)bVar32;
          uVar384 = auVar223._0_2_;
          uVar360 = (ushort)bVar35;
          uVar381 = auVar222._0_2_;
          puVar2 = Y + lVar337 + (ulong)Y_stride + 0x10;
          *puVar2 = (uVar363 != 0) * (uVar363 < 0x100) * bVar29 - (0xff < uVar363);
          puVar2[1] = (uVar352 != 0) * (uVar352 < 0x100) * bVar31 - (0xff < uVar352);
          puVar2[2] = (uVar381 != 0) * (uVar381 < 0x100) * cVar23 - (0xff < uVar381);
          puVar2[3] = (uVar360 != 0) * (uVar360 < 0x100) * bVar35 - (0xff < uVar360);
          puVar2[4] = (uVar384 != 0) * (uVar384 < 0x100) * cVar24 - (0xff < uVar384);
          puVar2[5] = (uVar361 != 0) * (uVar361 < 0x100) * bVar32 - (0xff < uVar361);
          puVar2[6] = (uVar387 != 0) * (uVar387 < 0x100) * cVar25 - (0xff < uVar387);
          puVar2[7] = (uVar362 != 0) * (uVar362 < 0x100) * bVar22 - (0xff < uVar362);
          puVar2[8] = (0 < sVar341) * (sVar341 < 0x100) * cVar26 - (0xff < sVar341);
          puVar2[9] = (bVar34 != 0) * (bVar34 < 0x100) * bVar34 - (0xff < bVar34);
          puVar2[10] = (0 < sVar364) * (sVar364 < 0x100) * cVar27 - (0xff < sVar364);
          puVar2[0xb] = (bVar36 != 0) * (bVar36 < 0x100) * bVar36 - (0xff < bVar36);
          puVar2[0xc] = (0 < sVar382) * (sVar382 < 0x100) * cVar28 - (0xff < sVar382);
          puVar2[0xd] = (bVar37 != 0) * (bVar37 < 0x100) * bVar37 - (0xff < bVar37);
          puVar2[0xe] = (bVar30 != 0) * (bVar30 < 0x100) * bVar30 - (0xff < bVar30);
          puVar2[0xf] = (bVar33 != 0) * (bVar33 < 0x100) * bVar33 - (0xff < bVar33);
          auVar466 = psraw(auVar465,2);
          local_68 = auVar358._0_2_;
          sStack_66 = auVar358._2_2_;
          auVar467._0_2_ = auVar466._0_2_ * local_68;
          auVar467._2_2_ = auVar466._2_2_ * sStack_66;
          auVar467._4_2_ = auVar466._4_2_ * local_68;
          auVar467._6_2_ = auVar466._6_2_ * sStack_66;
          auVar467._8_2_ = auVar466._8_2_ * local_68;
          auVar467._10_2_ = auVar466._10_2_ * sStack_66;
          auVar467._12_2_ = auVar466._12_2_ * local_68;
          auVar467._14_2_ = auVar466._14_2_ * sStack_66;
          auVar466 = psraw(auVar467,8);
          sVar396 = auVar466._0_2_ + 0x80;
          sVar397 = auVar466._2_2_ + 0x80;
          sVar398 = auVar466._4_2_ + 0x80;
          sVar399 = auVar466._6_2_ + 0x80;
          sVar400 = auVar466._8_2_ + 0x80;
          sVar401 = auVar466._10_2_ + 0x80;
          sVar402 = auVar466._12_2_ + 0x80;
          sVar403 = auVar466._14_2_ + 0x80;
          auVar466 = psraw(auVar495,2);
          auVar496._0_2_ = auVar466._0_2_ * local_68;
          auVar496._2_2_ = auVar466._2_2_ * sStack_66;
          auVar496._4_2_ = auVar466._4_2_ * local_68;
          auVar496._6_2_ = auVar466._6_2_ * sStack_66;
          auVar496._8_2_ = auVar466._8_2_ * local_68;
          auVar496._10_2_ = auVar466._10_2_ * sStack_66;
          auVar496._12_2_ = auVar466._12_2_ * local_68;
          auVar496._14_2_ = auVar466._14_2_ * sStack_66;
          auVar466 = psraw(auVar496,8);
          sVar493 = auVar466._0_2_ + 0x80;
          sVar497 = auVar466._2_2_ + 0x80;
          sVar506 = auVar466._4_2_ + 0x80;
          sVar515 = auVar466._6_2_ + 0x80;
          sVar516 = auVar466._8_2_ + 0x80;
          sVar517 = auVar466._10_2_ + 0x80;
          sVar518 = auVar466._12_2_ + 0x80;
          sVar519 = auVar466._14_2_ + 0x80;
          auVar466 = psraw(local_c8,2);
          local_78 = auVar359._0_2_;
          sStack_76 = auVar359._2_2_;
          auVar351._0_2_ = auVar466._0_2_ * local_78;
          auVar351._2_2_ = auVar466._2_2_ * sStack_76;
          auVar351._4_2_ = auVar466._4_2_ * local_78;
          auVar351._6_2_ = auVar466._6_2_ * sStack_76;
          auVar351._8_2_ = auVar466._8_2_ * local_78;
          auVar351._10_2_ = auVar466._10_2_ * sStack_76;
          auVar351._12_2_ = auVar466._12_2_ * local_78;
          auVar351._14_2_ = auVar466._14_2_ * sStack_76;
          auVar466 = psraw(auVar351,8);
          auVar486 = psraw(auVar485,2);
          auVar487._0_2_ = auVar486._0_2_ * local_78;
          auVar487._2_2_ = auVar486._2_2_ * sStack_76;
          auVar487._4_2_ = auVar486._4_2_ * local_78;
          auVar487._6_2_ = auVar486._6_2_ * sStack_76;
          auVar487._8_2_ = auVar486._8_2_ * local_78;
          auVar487._10_2_ = auVar486._10_2_ * sStack_76;
          auVar487._12_2_ = auVar486._12_2_ * local_78;
          auVar487._14_2_ = auVar486._14_2_ * sStack_76;
          auVar486 = psraw(auVar487,8);
          sVar341 = auVar466._0_2_ + 0x80;
          sVar364 = auVar466._2_2_ + 0x80;
          sVar382 = auVar466._4_2_ + 0x80;
          sVar385 = auVar466._6_2_ + 0x80;
          sVar388 = auVar466._8_2_ + 0x80;
          sVar390 = auVar466._10_2_ + 0x80;
          sVar392 = auVar466._12_2_ + 0x80;
          sVar394 = auVar466._14_2_ + 0x80;
          sVar404 = auVar486._0_2_ + 0x80;
          sVar446 = auVar486._2_2_ + 0x80;
          sVar448 = auVar486._4_2_ + 0x80;
          sVar488 = auVar486._6_2_ + 0x80;
          sVar489 = auVar486._8_2_ + 0x80;
          sVar490 = auVar486._10_2_ + 0x80;
          sVar491 = auVar486._12_2_ + 0x80;
          sVar492 = auVar486._14_2_ + 0x80;
          puVar2 = U + uVar335;
          *puVar2 = (0 < sVar396) * (sVar396 < 0x100) * (char)sVar396 - (0xff < sVar396);
          puVar2[1] = (0 < sVar397) * (sVar397 < 0x100) * (char)sVar397 - (0xff < sVar397);
          puVar2[2] = (0 < sVar398) * (sVar398 < 0x100) * (char)sVar398 - (0xff < sVar398);
          puVar2[3] = (0 < sVar399) * (sVar399 < 0x100) * (char)sVar399 - (0xff < sVar399);
          puVar2[4] = (0 < sVar400) * (sVar400 < 0x100) * (char)sVar400 - (0xff < sVar400);
          puVar2[5] = (0 < sVar401) * (sVar401 < 0x100) * (char)sVar401 - (0xff < sVar401);
          puVar2[6] = (0 < sVar402) * (sVar402 < 0x100) * (char)sVar402 - (0xff < sVar402);
          puVar2[7] = (0 < sVar403) * (sVar403 < 0x100) * (char)sVar403 - (0xff < sVar403);
          puVar2[8] = (0 < sVar493) * (sVar493 < 0x100) * (char)sVar493 - (0xff < sVar493);
          puVar2[9] = (0 < sVar497) * (sVar497 < 0x100) * (char)sVar497 - (0xff < sVar497);
          puVar2[10] = (0 < sVar506) * (sVar506 < 0x100) * (char)sVar506 - (0xff < sVar506);
          puVar2[0xb] = (0 < sVar515) * (sVar515 < 0x100) * (char)sVar515 - (0xff < sVar515);
          puVar2[0xc] = (0 < sVar516) * (sVar516 < 0x100) * (char)sVar516 - (0xff < sVar516);
          puVar2[0xd] = (0 < sVar517) * (sVar517 < 0x100) * (char)sVar517 - (0xff < sVar517);
          puVar2[0xe] = (0 < sVar518) * (sVar518 < 0x100) * (char)sVar518 - (0xff < sVar518);
          puVar2[0xf] = (0 < sVar519) * (sVar519 < 0x100) * (char)sVar519 - (0xff < sVar519);
          puVar2 = V + uVar335;
          *puVar2 = (0 < sVar341) * (sVar341 < 0x100) * (char)sVar341 - (0xff < sVar341);
          puVar2[1] = (0 < sVar364) * (sVar364 < 0x100) * (char)sVar364 - (0xff < sVar364);
          puVar2[2] = (0 < sVar382) * (sVar382 < 0x100) * (char)sVar382 - (0xff < sVar382);
          puVar2[3] = (0 < sVar385) * (sVar385 < 0x100) * (char)sVar385 - (0xff < sVar385);
          puVar2[4] = (0 < sVar388) * (sVar388 < 0x100) * (char)sVar388 - (0xff < sVar388);
          puVar2[5] = (0 < sVar390) * (sVar390 < 0x100) * (char)sVar390 - (0xff < sVar390);
          puVar2[6] = (0 < sVar392) * (sVar392 < 0x100) * (char)sVar392 - (0xff < sVar392);
          puVar2[7] = (0 < sVar394) * (sVar394 < 0x100) * (char)sVar394 - (0xff < sVar394);
          puVar2[8] = (0 < sVar404) * (sVar404 < 0x100) * (char)sVar404 - (0xff < sVar404);
          puVar2[9] = (0 < sVar446) * (sVar446 < 0x100) * (char)sVar446 - (0xff < sVar446);
          puVar2[10] = (0 < sVar448) * (sVar448 < 0x100) * (char)sVar448 - (0xff < sVar448);
          puVar2[0xb] = (0 < sVar488) * (sVar488 < 0x100) * (char)sVar488 - (0xff < sVar488);
          puVar2[0xc] = (0 < sVar489) * (sVar489 < 0x100) * (char)sVar489 - (0xff < sVar489);
          puVar2[0xd] = (0 < sVar490) * (sVar490 < 0x100) * (char)sVar490 - (0xff < sVar490);
          puVar2[0xe] = (0 < sVar491) * (sVar491 < 0x100) * (char)sVar491 - (0xff < sVar491);
          puVar2[0xf] = (0 < sVar492) * (sVar492 < 0x100) * (char)sVar492 - (0xff < sVar492);
          lVar337 = lVar337 + 0x20;
          puVar336 = puVar336 + 0x60;
          uVar335 = uVar335 + 0x10;
        } while ((uint)lVar337 < width - 0x1f);
      }
      uVar339 = uVar339 + 2;
      uVar338 = uVar338 + iVar38;
      RGB_stride = RGB_stride + iVar38;
      uVar340 = (ulong)(uint)((int)uVar340 + iVar39);
      Y_stride = Y_stride + iVar39;
    } while (uVar339 < height - 1);
  }
  return;
}

Assistant:

void rgb24_yuv420_sseu(uint32_t width, uint32_t height, 
	const uint8_t *RGB, uint32_t RGB_stride, 
	uint8_t *Y, uint8_t *U, uint8_t *V, uint32_t Y_stride, uint32_t UV_stride, 
	YCbCrType yuv_type)
{
	#define LOAD_SI128 _mm_loadu_si128
	#define SAVE_SI128 _mm_storeu_si128
	const RGB2YUVParam *const param = &(RGB2YUV[yuv_type]);
	
	uint32_t x, y;
	for(y=0; y<(height-1); y+=2)
	{
		const uint8_t *rgb_ptr1=RGB+y*RGB_stride,
			*rgb_ptr2=RGB+(y+1)*RGB_stride;
		
		uint8_t *y_ptr1=Y+y*Y_stride,
			*y_ptr2=Y+(y+1)*Y_stride,
			*u_ptr=U+(y/2)*UV_stride,
			*v_ptr=V+(y/2)*UV_stride;
		
		for(x=0; x<(width-31); x+=32)
		{
			RGB2YUV_32
			
			rgb_ptr1+=96;
			rgb_ptr2+=96;
			y_ptr1+=32;
			y_ptr2+=32;
			u_ptr+=16; 
			v_ptr+=16;
		}
	}
	#undef LOAD_SI128
	#undef SAVE_SI128
}